

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  BVH *bvh;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  GridSOA *pGVar36;
  bool bVar37;
  uint uVar38;
  int iVar39;
  AABBNodeMB4D *node1;
  ulong uVar40;
  char *pcVar41;
  undefined8 uVar42;
  size_t sVar43;
  undefined4 uVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar48;
  long lVar49;
  long lVar50;
  NodeRef *pNVar51;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar52;
  long lVar53;
  ulong uVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar78;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar75;
  float fVar76;
  float fVar77;
  undefined1 in_ZMM0 [64];
  float fVar79;
  float fVar100;
  float fVar101;
  undefined1 auVar80 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar102;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar127;
  float fVar129;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar126;
  float fVar128;
  undefined1 auVar125 [64];
  vint4 ai_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  vint4 bi_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vint4 bi_3;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar184;
  float fVar186;
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar189;
  undefined1 auVar178 [16];
  float fVar187;
  undefined1 auVar179 [16];
  float fVar185;
  float fVar188;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar190;
  float fVar201;
  float fVar202;
  vint4 bi_2;
  undefined1 auVar191 [16];
  float fVar203;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar212;
  float fVar214;
  undefined1 auVar205 [16];
  float fVar217;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar213;
  float fVar215;
  float fVar216;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar219;
  float fVar220;
  float fVar226;
  float fVar228;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar229;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar227;
  undefined1 auVar225 [16];
  float fVar230;
  float fVar235;
  float fVar237;
  undefined1 auVar231 [16];
  float fVar236;
  float fVar238;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar239;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar247;
  float fVar249;
  float fVar250;
  undefined1 auVar248 [16];
  float fVar251;
  float fVar254;
  float fVar255;
  float fVar256;
  vint4 ai;
  undefined1 auVar252 [16];
  float fVar257;
  undefined1 auVar253 [16];
  float fVar258;
  float fVar259;
  float fVar262;
  float fVar263;
  vint4 ai_1;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar270;
  float fVar271;
  vint4 ai_3;
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  undefined1 auVar269 [16];
  undefined1 local_1c58 [8];
  float fStack_1c50;
  float fStack_1c4c;
  float local_1c48;
  float fStack_1c44;
  float fStack_1c40;
  float local_1c18;
  float fStack_1c14;
  float fStack_1c10;
  undefined1 local_1bf8 [16];
  ulong local_1be8;
  RayK<4> *local_1be0;
  char *local_1bd8;
  uint local_1bd0;
  undefined4 local_1bcc;
  undefined1 local_1bc8 [16];
  undefined1 local_1bb8 [16];
  undefined1 local_1ba8 [16];
  undefined1 local_1b98 [16];
  undefined1 local_1b88 [8];
  float fStack_1b80;
  float fStack_1b7c;
  undefined1 local_1b78 [8];
  undefined8 uStack_1b70;
  vbool<4> terminated;
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  undefined1 local_1ae8 [8];
  float fStack_1ae0;
  float fStack_1adc;
  float local_1a08;
  float fStack_1a04;
  float fStack_1a00;
  float fStack_19fc;
  float local_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  vint<4> vitime;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  undefined8 uStack_19b0;
  float local_19a8;
  float fStack_19a4;
  float fStack_19a0;
  float fStack_199c;
  float local_1998;
  float fStack_1994;
  float fStack_1990;
  float fStack_198c;
  undefined1 local_1988 [16];
  undefined1 local_1978 [16];
  uint local_1968;
  uint uStack_1964;
  uint uStack_1960;
  uint uStack_195c;
  uint uStack_1958;
  uint uStack_1954;
  uint uStack_1950;
  uint uStack_194c;
  TravRayK<4,_false> tray;
  uint local_1828;
  uint uStack_1824;
  uint uStack_1820;
  uint uStack_181c;
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [8];
  float fStack_17b0;
  float fStack_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [8];
  float fStack_1740;
  float fStack_173c;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 uStack_16e0;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar232 [16];
  
  uVar35 = mm_lookupmask_ps._8_8_;
  uVar34 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar124 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar105 = vpcmpeqd_avx(auVar124,(undefined1  [16])valid_i->field_0);
    auVar80 = ZEXT816(0) << 0x40;
    auVar8 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar80,5);
    auVar142 = auVar105 & auVar8;
    if ((((auVar142 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar142 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar142 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar142[0xf] < '\0'
       ) {
      auVar8 = vandps_avx(auVar8,auVar105);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar73._8_4_ = 0x7fffffff;
      auVar73._0_8_ = 0x7fffffff7fffffff;
      auVar73._12_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar73,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar105 = vcmpps_avx(auVar105,auVar221,1);
      auVar142 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar221,
                               auVar105);
      auVar105 = vandps_avx(auVar73,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar105 = vcmpps_avx(auVar105,auVar221,1);
      auVar143 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar221,
                               auVar105);
      auVar105 = vandps_avx(auVar73,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar105 = vcmpps_avx(auVar105,auVar221,1);
      auVar105 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar221,
                               auVar105);
      auVar74 = vrcpps_avx(auVar142);
      fVar10 = auVar74._0_4_;
      auVar65._0_4_ = auVar142._0_4_ * fVar10;
      fVar11 = auVar74._4_4_;
      auVar65._4_4_ = auVar142._4_4_ * fVar11;
      fVar103 = auVar74._8_4_;
      auVar65._8_4_ = auVar142._8_4_ * fVar103;
      fVar126 = auVar74._12_4_;
      auVar65._12_4_ = auVar142._12_4_ * fVar126;
      auVar153._8_4_ = 0x3f800000;
      auVar153._0_8_ = 0x3f8000003f800000;
      auVar153._12_4_ = 0x3f800000;
      auVar142 = vsubps_avx(auVar153,auVar65);
      tray.rdir.field_0._0_4_ = fVar10 + fVar10 * auVar142._0_4_;
      tray.rdir.field_0._4_4_ = fVar11 + fVar11 * auVar142._4_4_;
      tray.rdir.field_0._8_4_ = fVar103 + fVar103 * auVar142._8_4_;
      tray.rdir.field_0._12_4_ = fVar126 + fVar126 * auVar142._12_4_;
      auVar142 = vrcpps_avx(auVar143);
      fVar10 = auVar142._0_4_;
      auVar74._0_4_ = auVar143._0_4_ * fVar10;
      fVar11 = auVar142._4_4_;
      auVar74._4_4_ = auVar143._4_4_ * fVar11;
      fVar103 = auVar142._8_4_;
      auVar74._8_4_ = auVar143._8_4_ * fVar103;
      fVar126 = auVar142._12_4_;
      auVar74._12_4_ = auVar143._12_4_ * fVar126;
      auVar142 = vsubps_avx(auVar153,auVar74);
      tray.rdir.field_0._16_4_ = fVar10 + fVar10 * auVar142._0_4_;
      tray.rdir.field_0._20_4_ = fVar11 + fVar11 * auVar142._4_4_;
      tray.rdir.field_0._24_4_ = fVar103 + fVar103 * auVar142._8_4_;
      tray.rdir.field_0._28_4_ = fVar126 + fVar126 * auVar142._12_4_;
      auVar142 = vrcpps_avx(auVar105);
      fVar10 = auVar142._0_4_;
      auVar152._0_4_ = auVar105._0_4_ * fVar10;
      fVar11 = auVar142._4_4_;
      auVar152._4_4_ = auVar105._4_4_ * fVar11;
      fVar103 = auVar142._8_4_;
      auVar152._8_4_ = auVar105._8_4_ * fVar103;
      fVar126 = auVar142._12_4_;
      auVar152._12_4_ = auVar105._12_4_ * fVar126;
      auVar105 = vsubps_avx(auVar153,auVar152);
      tray.rdir.field_0._32_4_ = fVar10 + fVar10 * auVar105._0_4_;
      tray.rdir.field_0._36_4_ = fVar11 + fVar11 * auVar105._4_4_;
      tray.rdir.field_0._40_4_ = fVar103 + fVar103 * auVar105._8_4_;
      tray.rdir.field_0._44_4_ = fVar126 + fVar126 * auVar105._12_4_;
      auVar105 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar80,1);
      auVar174._8_4_ = 0x10;
      auVar174._0_8_ = 0x1000000010;
      auVar174._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar105,auVar174);
      auVar105 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar80,5);
      auVar142._8_4_ = 0x20;
      auVar142._0_8_ = 0x2000000020;
      auVar142._12_4_ = 0x20;
      auVar171._8_4_ = 0x30;
      auVar171._0_8_ = 0x3000000030;
      auVar171._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar171,auVar142,auVar105);
      auVar105 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar80,5);
      auVar143._8_4_ = 0x40;
      auVar143._0_8_ = 0x4000000040;
      auVar143._12_4_ = 0x40;
      auVar83._8_4_ = 0x50;
      auVar83._0_8_ = 0x5000000050;
      auVar83._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar83,auVar143,auVar105);
      auVar105 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar80);
      auVar142 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar80);
      auVar80._8_4_ = 0x7f800000;
      auVar80._0_8_ = 0x7f8000007f800000;
      auVar80._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar80,auVar105,auVar8);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar105,auVar142,auVar8);
      terminated.field_0.i[1] = auVar8._4_4_ ^ auVar124._4_4_;
      terminated.field_0.i[0] = auVar8._0_4_ ^ auVar124._0_4_;
      terminated.field_0.i[2] = auVar8._8_4_ ^ auVar124._8_4_;
      terminated.field_0.i[3] = auVar8._12_4_ ^ auVar124._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar48 = 3;
      }
      else {
        uVar48 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1be0 = ray + 0x80;
      pNVar51 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar52 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      bVar14 = (byte)uVar48;
      local_1be8 = uVar48;
LAB_01522f32:
      do {
        do {
          root.ptr = pNVar51[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0152492c;
          pNVar51 = pNVar51 + -1;
          paVar52 = paVar52 + -1;
          aVar81.i = *(int (*) [4])paVar52;
          auVar124 = vcmpps_avx((undefined1  [16])aVar81,(undefined1  [16])tray.tfar.field_0,1);
          uVar38 = vmovmskps_avx(auVar124);
        } while (uVar38 == 0);
        uVar54 = (ulong)(uVar38 & 0xff);
        uVar40 = (ulong)(uint)POPCOUNT(uVar38 & 0xff);
        if (uVar48 < uVar40) {
LAB_01522f73:
          auVar125 = ZEXT1664((undefined1  [16])aVar81);
          do {
            uVar38 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0152492c;
              auVar124 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar125._0_16_,6);
              if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar124[0xf] < '\0') {
                if ((uVar38 & 0xf) == 8) {
                  auVar106._0_4_ = (float)((pre.super_Precalculations.grid)->time_steps - 1);
                  auVar106._4_8_ = SUB128(ZEXT812(0),4);
                  auVar106._12_4_ = 0;
                  auVar124 = vshufps_avx(auVar106,auVar106,0);
                  auVar82._0_4_ = auVar124._0_4_ * *(float *)(ray + 0x70);
                  auVar82._4_4_ = auVar124._4_4_ * *(float *)(ray + 0x74);
                  auVar82._8_4_ = auVar124._8_4_ * *(float *)(ray + 0x78);
                  auVar82._12_4_ = auVar124._12_4_ * *(float *)(ray + 0x7c);
                  auVar124 = vroundps_avx(auVar82,1);
                  auVar105 = vshufps_avx(ZEXT416((uint)(auVar106._0_4_ + -1.0)),
                                         ZEXT416((uint)(auVar106._0_4_ + -1.0)),0);
                  auVar124 = vminps_avx(auVar124,auVar105);
                  auVar124 = vmaxps_avx(auVar124,_DAT_01f7aa10);
                  aVar9 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar124);
                  vitime.field_0 = aVar9;
                  uVar38 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                  uVar38 = uVar38 ^ 0xf;
                  aVar75 = terminated.field_0;
                  if (uVar38 != 0) {
                    auVar124 = vsubps_avx(auVar82,auVar124);
                    auVar107._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                    auVar107._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                    auVar107._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                    auVar56._8_4_ = 0x3f800000;
                    auVar56._0_8_ = 0x3f8000003f800000;
                    auVar56._12_4_ = 0x3f800000;
                    auVar105 = vsubps_avx(auVar56,auVar124);
                    uVar48 = root.ptr >> 2 & 0xfffffffffffffffc;
                    auVar142 = auVar107;
                    do {
                      pGVar36 = pre.super_Precalculations.grid;
                      lVar45 = 0;
                      if ((uVar38 & 0xf) != 0) {
                        for (; ((uVar38 & 0xf) >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                        }
                      }
                      auVar80 = vpshufd_avx(ZEXT416((uint)vitime.field_0.i[(int)lVar45]),0);
                      auVar80 = vpcmpeqd_avx(auVar80,(undefined1  [16])aVar9);
                      auVar80 = vpand_avx(auVar80,auVar142);
                      auVar143 = auVar80 ^ _DAT_01f7ae20;
                      uVar40 = (ulong)(pre.super_Precalculations.grid)->dim_offset;
                      uVar38 = (pre.super_Precalculations.grid)->width;
                      local_1bd0 = (pre.super_Precalculations.grid)->height;
                      lVar46 = (ulong)(pre.super_Precalculations.grid)->gridBytes *
                               (long)vitime.field_0.i[(int)lVar45] +
                               (ulong)(pre.super_Precalculations.grid)->gridOffset;
                      uVar54 = (ulong)((pre.super_Precalculations.grid)->gridBytes & 0xfffffffc);
                      lVar45 = lVar46 + uVar54;
                      lVar21 = lVar45 + uVar40 * 0xc + uVar48;
                      lVar49 = (ulong)uVar38 * 4;
                      lVar1 = lVar46 + uVar40 * 8;
                      lVar20 = uVar54 + lVar1 + uVar48;
                      lVar22 = lVar45 + uVar40 * 4 + uVar48;
                      lVar2 = lVar46 + uVar40 * 4;
                      pcVar41 = (pre.super_Precalculations.grid)->data + (uVar48 - 4);
                      uVar42 = CONCAT71((int7)((ulong)pcVar41 >> 8),1);
                      lVar53 = 0;
                      auVar125 = ZEXT1664(auVar80);
                      do {
                        local_1bcc = (undefined4)uVar42;
                        lVar50 = (lVar53 + 1) * lVar49;
                        lVar23 = lVar50 + lVar21;
                        lVar25 = lVar50 + lVar20;
                        lVar27 = lVar50 + lVar22;
                        lVar29 = lVar50 + lVar45 + uVar48;
                        lVar31 = lVar50 + lVar1 + uVar48 + 0x30;
                        lVar32 = lVar50 + lVar2 + uVar48 + 0x30;
                        lVar50 = lVar50 + lVar46 + uVar48;
                        lVar53 = lVar53 * lVar49;
                        lVar24 = lVar53 + lVar21;
                        lVar26 = lVar53 + lVar20;
                        lVar28 = lVar53 + lVar22;
                        lVar30 = lVar53 + lVar45 + uVar48;
                        lVar33 = lVar53 + lVar2;
                        local_1bd8 = pcVar41 + lVar53 + lVar46;
                        lVar47 = 0;
                        do {
                          if ((ulong)((ulong)uVar38 != 2) * 4 + 4 == lVar47) break;
                          fVar10 = *(float *)(local_1bd8 + lVar47);
                          fVar11 = *(float *)(pcVar41 + lVar47 + lVar33);
                          fVar103 = *(float *)(pcVar41 + lVar47 + lVar53 + lVar1);
                          fVar126 = *(float *)(local_1bd8 + lVar47 + 4);
                          auVar83 = auVar125._0_16_;
                          fVar55 = *(float *)(pcVar41 + lVar47 + lVar33 + 4);
                          fVar76 = *(float *)(pcVar41 + lVar47 + lVar53 + lVar1 + 4);
                          fVar77 = *(float *)(pGVar36->data + lVar47 + lVar50 + -4);
                          fVar78 = *(float *)(pGVar36->data + lVar47 + lVar32 + -0x34);
                          fVar3 = *(float *)(pGVar36->data + lVar47 + lVar31 + -0x34);
                          fVar204 = *(float *)(pGVar36->data + lVar47 + lVar30 + -4);
                          fVar4 = *(float *)(pGVar36->data + lVar47 + lVar28 + -4);
                          fVar216 = *(float *)(pGVar36->data + lVar47 + lVar26 + -4);
                          fVar212 = *(float *)(pGVar36->data + lVar47 + lVar30);
                          fVar185 = *(float *)(pGVar36->data + lVar47 + lVar28);
                          fVar188 = *(float *)(pGVar36->data + lVar47 + lVar26);
                          fVar214 = *(float *)(pGVar36->data + lVar47 + lVar29 + -4);
                          local_19f8 = auVar124._0_4_;
                          fStack_19f4 = auVar124._4_4_;
                          fStack_19f0 = auVar124._8_4_;
                          fStack_19ec = auVar124._12_4_;
                          local_1a08 = auVar105._0_4_;
                          fStack_1a04 = auVar105._4_4_;
                          fStack_1a00 = auVar105._8_4_;
                          fStack_19fc = auVar105._12_4_;
                          local_1c58._4_4_ = fVar204 * fStack_19f4 + fStack_1a04 * fVar10;
                          local_1c58._0_4_ = fVar204 * local_19f8 + local_1a08 * fVar10;
                          fStack_1c50 = fVar204 * fStack_19f0 + fStack_1a00 * fVar10;
                          fStack_1c4c = fVar204 * fStack_19ec + fStack_19fc * fVar10;
                          fVar10 = *(float *)(pGVar36->data + lVar47 + lVar27 + -4);
                          auVar157._0_4_ = fVar4 * local_19f8 + local_1a08 * fVar11;
                          auVar157._4_4_ = fVar4 * fStack_19f4 + fStack_1a04 * fVar11;
                          auVar157._8_4_ = fVar4 * fStack_19f0 + fStack_1a00 * fVar11;
                          auVar157._12_4_ = fVar4 * fStack_19ec + fStack_19fc * fVar11;
                          fVar11 = *(float *)(pGVar36->data + lVar47 + lVar25 + -4);
                          auVar131._0_4_ = fVar216 * local_19f8 + local_1a08 * fVar103;
                          auVar131._4_4_ = fVar216 * fStack_19f4 + fStack_1a04 * fVar103;
                          auVar131._8_4_ = fVar216 * fStack_19f0 + fStack_1a00 * fVar103;
                          auVar131._12_4_ = fVar216 * fStack_19ec + fStack_19fc * fVar103;
                          local_1b78._4_4_ = fStack_1a04 * fVar126 + fVar212 * fStack_19f4;
                          local_1b78._0_4_ = local_1a08 * fVar126 + fVar212 * local_19f8;
                          uStack_1b70._0_4_ = fStack_1a00 * fVar126 + fVar212 * fStack_19f0;
                          uStack_1b70._4_4_ = fStack_19fc * fVar126 + fVar212 * fStack_19ec;
                          fVar79 = fVar185 * local_19f8 + local_1a08 * fVar55;
                          fVar100 = fVar185 * fStack_19f4 + fStack_1a04 * fVar55;
                          fVar101 = fVar185 * fStack_19f0 + fStack_1a00 * fVar55;
                          fVar102 = fVar185 * fStack_19ec + fStack_19fc * fVar55;
                          local_1ae8._4_4_ = fVar188 * fStack_19f4 + fStack_1a04 * fVar76;
                          local_1ae8._0_4_ = fVar188 * local_19f8 + local_1a08 * fVar76;
                          fStack_1ae0 = fVar188 * fStack_19f0 + fStack_1a00 * fVar76;
                          fStack_1adc = fVar188 * fStack_19ec + fStack_19fc * fVar76;
                          auVar231._0_4_ = local_1a08 * fVar77 + fVar214 * local_19f8;
                          auVar231._4_4_ = fStack_1a04 * fVar77 + fVar214 * fStack_19f4;
                          auVar231._8_4_ = fStack_1a00 * fVar77 + fVar214 * fStack_19f0;
                          auVar231._12_4_ = fStack_19fc * fVar77 + fVar214 * fStack_19ec;
                          auVar57._0_4_ = local_1a08 * fVar78 + fVar10 * local_19f8;
                          auVar57._4_4_ = fStack_1a04 * fVar78 + fVar10 * fStack_19f4;
                          auVar57._8_4_ = fStack_1a00 * fVar78 + fVar10 * fStack_19f0;
                          auVar57._12_4_ = fStack_19fc * fVar78 + fVar10 * fStack_19ec;
                          auVar84._0_4_ = local_1a08 * fVar3 + fVar11 * local_19f8;
                          auVar84._4_4_ = fStack_1a04 * fVar3 + fVar11 * fStack_19f4;
                          auVar84._8_4_ = fStack_1a00 * fVar3 + fVar11 * fStack_19f0;
                          auVar84._12_4_ = fStack_19fc * fVar3 + fVar11 * fStack_19ec;
                          auVar74 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar65 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar174 = vsubps_avx(auVar157,auVar74);
                          auVar171 = vsubps_avx(auVar131,auVar65);
                          auVar73 = vsubps_avx(auVar57,auVar74);
                          auVar153 = vsubps_avx(auVar84,auVar65);
                          auVar221 = vsubps_avx(auVar73,auVar174);
                          local_1bc8 = vsubps_avx(auVar153,auVar171);
                          fVar263 = auVar174._0_4_;
                          fVar190 = fVar263 + auVar73._0_4_;
                          fVar265 = auVar174._4_4_;
                          fVar201 = fVar265 + auVar73._4_4_;
                          fVar266 = auVar174._8_4_;
                          fVar202 = fVar266 + auVar73._8_4_;
                          fVar270 = auVar174._12_4_;
                          fVar203 = fVar270 + auVar73._12_4_;
                          fVar10 = auVar171._0_4_;
                          fVar204 = auVar153._0_4_ + fVar10;
                          fVar11 = auVar171._4_4_;
                          fVar212 = auVar153._4_4_ + fVar11;
                          fVar103 = auVar171._8_4_;
                          fVar214 = auVar153._8_4_ + fVar103;
                          fVar126 = auVar171._12_4_;
                          fVar217 = auVar153._12_4_ + fVar126;
                          fVar55 = local_1bc8._0_4_;
                          auVar58._0_4_ = fVar190 * fVar55;
                          fVar78 = local_1bc8._4_4_;
                          auVar58._4_4_ = fVar201 * fVar78;
                          fVar4 = local_1bc8._8_4_;
                          auVar58._8_4_ = fVar202 * fVar4;
                          fVar185 = local_1bc8._12_4_;
                          auVar58._12_4_ = fVar203 * fVar185;
                          fVar76 = auVar221._0_4_;
                          auVar222._0_4_ = fVar204 * fVar76;
                          fVar3 = auVar221._4_4_;
                          auVar222._4_4_ = fVar212 * fVar3;
                          fVar216 = auVar221._8_4_;
                          auVar222._8_4_ = fVar214 * fVar216;
                          fVar188 = auVar221._12_4_;
                          auVar222._12_4_ = fVar217 * fVar188;
                          auVar66 = vsubps_avx(auVar222,auVar58);
                          auVar152 = *(undefined1 (*) [16])ray;
                          auVar12 = vsubps_avx(_local_1c58,auVar152);
                          auVar13 = vsubps_avx(auVar231,auVar152);
                          auVar130 = vsubps_avx(auVar13,auVar12);
                          fVar77 = auVar130._0_4_;
                          auVar206._0_4_ = fVar204 * fVar77;
                          fVar204 = auVar130._4_4_;
                          auVar206._4_4_ = fVar212 * fVar204;
                          fVar212 = auVar130._8_4_;
                          auVar206._8_4_ = fVar214 * fVar212;
                          fVar214 = auVar130._12_4_;
                          auVar206._12_4_ = fVar217 * fVar214;
                          fVar219 = auVar12._0_4_;
                          fVar217 = fVar219 + auVar13._0_4_;
                          fVar226 = auVar12._4_4_;
                          fVar235 = fVar226 + auVar13._4_4_;
                          fVar228 = auVar12._8_4_;
                          fVar237 = fVar228 + auVar13._8_4_;
                          fVar229 = auVar12._12_4_;
                          fVar238 = fVar229 + auVar13._12_4_;
                          auVar261._0_4_ = fVar217 * fVar55;
                          auVar261._4_4_ = fVar235 * fVar78;
                          auVar261._8_4_ = fVar237 * fVar4;
                          auVar261._12_4_ = fVar238 * fVar185;
                          auVar130 = vsubps_avx(auVar261,auVar206);
                          auVar207._0_4_ = fVar217 * fVar76;
                          auVar207._4_4_ = fVar235 * fVar3;
                          auVar207._8_4_ = fVar237 * fVar216;
                          auVar207._12_4_ = fVar238 * fVar188;
                          auVar192._0_4_ = fVar77 * fVar190;
                          auVar192._4_4_ = fVar204 * fVar201;
                          auVar192._8_4_ = fVar212 * fVar202;
                          auVar192._12_4_ = fVar214 * fVar203;
                          auVar144 = vsubps_avx(auVar192,auVar207);
                          auVar17 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar190 = *(float *)(ray + 0x6c);
                          auVar18 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar201 = *(float *)(ray + 0x5c);
                          fVar202 = *(float *)(ray + 0x40);
                          fVar203 = *(float *)(ray + 0x44);
                          fVar217 = *(float *)(ray + 0x48);
                          auVar19 = *(undefined1 (*) [12])(ray + 0x40);
                          fVar235 = *(float *)(ray + 0x4c);
                          fVar230 = auVar66._0_4_ * fVar202 +
                                    auVar144._0_4_ * *(float *)(ray + 0x60) +
                                    auVar130._0_4_ * *(float *)(ray + 0x50);
                          fVar236 = auVar66._4_4_ * fVar203 +
                                    auVar144._4_4_ * *(float *)(ray + 100) +
                                    auVar130._4_4_ * *(float *)(ray + 0x54);
                          auVar232._0_8_ = CONCAT44(fVar236,fVar230);
                          auVar232._8_4_ =
                               auVar66._8_4_ * fVar217 +
                               auVar144._8_4_ * *(float *)(ray + 0x68) +
                               auVar130._8_4_ * *(float *)(ray + 0x58);
                          auVar232._12_4_ =
                               auVar66._12_4_ * fVar235 +
                               auVar144._12_4_ * fVar190 + auVar130._12_4_ * fVar201;
                          auVar15._4_4_ = fVar100;
                          auVar15._0_4_ = fVar79;
                          auVar15._8_4_ = fVar101;
                          auVar15._12_4_ = fVar102;
                          auVar74 = vsubps_avx(auVar15,auVar74);
                          auVar65 = vsubps_avx(_local_1ae8,auVar65);
                          auVar66 = vsubps_avx(auVar174,auVar74);
                          auVar130 = vsubps_avx(auVar171,auVar65);
                          fVar237 = fVar263 + auVar74._0_4_;
                          fVar238 = fVar265 + auVar74._4_4_;
                          fVar186 = fVar266 + auVar74._8_4_;
                          fVar189 = fVar270 + auVar74._12_4_;
                          fVar239 = fVar10 + auVar65._0_4_;
                          fVar243 = fVar11 + auVar65._4_4_;
                          fVar244 = fVar103 + auVar65._8_4_;
                          fVar246 = fVar126 + auVar65._12_4_;
                          fVar257 = auVar130._0_4_;
                          auVar268._0_4_ = fVar257 * fVar237;
                          fVar258 = auVar130._4_4_;
                          auVar268._4_4_ = fVar258 * fVar238;
                          fVar259 = auVar130._8_4_;
                          auVar268._8_4_ = fVar259 * fVar186;
                          fVar262 = auVar130._12_4_;
                          auVar268._12_4_ = fVar262 * fVar189;
                          fVar245 = auVar66._0_4_;
                          auVar193._0_4_ = fVar245 * fVar239;
                          fVar247 = auVar66._4_4_;
                          auVar193._4_4_ = fVar247 * fVar243;
                          fVar249 = auVar66._8_4_;
                          auVar193._8_4_ = fVar249 * fVar244;
                          fVar250 = auVar66._12_4_;
                          auVar193._12_4_ = fVar250 * fVar246;
                          auVar66 = vsubps_avx(auVar193,auVar268);
                          auVar152 = vsubps_avx(_local_1b78,auVar152);
                          auVar12 = vsubps_avx(auVar12,auVar152);
                          fVar251 = auVar12._0_4_;
                          auVar240._0_4_ = fVar251 * fVar239;
                          fVar254 = auVar12._4_4_;
                          auVar240._4_4_ = fVar254 * fVar243;
                          fVar255 = auVar12._8_4_;
                          auVar240._8_4_ = fVar255 * fVar244;
                          fVar256 = auVar12._12_4_;
                          auVar240._12_4_ = fVar256 * fVar246;
                          fVar239 = auVar152._0_4_ + fVar219;
                          fVar243 = auVar152._4_4_ + fVar226;
                          fVar244 = auVar152._8_4_ + fVar228;
                          fVar246 = auVar152._12_4_ + fVar229;
                          auVar208._0_4_ = fVar239 * fVar257;
                          auVar208._4_4_ = fVar243 * fVar258;
                          auVar208._8_4_ = fVar244 * fVar259;
                          auVar208._12_4_ = fVar246 * fVar262;
                          auVar12 = vsubps_avx(auVar208,auVar240);
                          auVar241._0_4_ = fVar239 * fVar245;
                          auVar241._4_4_ = fVar243 * fVar247;
                          auVar241._8_4_ = fVar244 * fVar249;
                          auVar241._12_4_ = fVar246 * fVar250;
                          auVar178._0_4_ = fVar251 * fVar237;
                          auVar178._4_4_ = fVar254 * fVar238;
                          auVar178._8_4_ = fVar255 * fVar186;
                          auVar178._12_4_ = fVar256 * fVar189;
                          auVar130 = vsubps_avx(auVar178,auVar241);
                          local_1c58._0_4_ = auVar17._0_4_;
                          local_1c58._4_4_ = auVar17._4_4_;
                          fStack_1c50 = auVar17._8_4_;
                          local_1c48 = auVar18._0_4_;
                          fStack_1c44 = auVar18._4_4_;
                          fStack_1c40 = auVar18._8_4_;
                          local_1b88._0_4_ =
                               fVar202 * auVar66._0_4_ +
                               local_1c48 * auVar12._0_4_ + auVar130._0_4_ * (float)local_1c58._0_4_
                          ;
                          local_1b88._4_4_ =
                               fVar203 * auVar66._4_4_ +
                               fStack_1c44 * auVar12._4_4_ +
                               auVar130._4_4_ * (float)local_1c58._4_4_;
                          fStack_1b80 = fVar217 * auVar66._8_4_ +
                                        fStack_1c40 * auVar12._8_4_ + auVar130._8_4_ * fStack_1c50;
                          fStack_1b7c = fVar235 * auVar66._12_4_ +
                                        fVar201 * auVar12._12_4_ + auVar130._12_4_ * fVar190;
                          auVar66 = vsubps_avx(auVar152,auVar13);
                          fVar237 = auVar152._0_4_ + auVar13._0_4_;
                          fVar238 = auVar152._4_4_ + auVar13._4_4_;
                          fVar186 = auVar152._8_4_ + auVar13._8_4_;
                          fVar189 = auVar152._12_4_ + auVar13._12_4_;
                          auVar152 = vsubps_avx(auVar74,auVar73);
                          fVar239 = auVar74._0_4_ + auVar73._0_4_;
                          fVar243 = auVar74._4_4_ + auVar73._4_4_;
                          fVar244 = auVar74._8_4_ + auVar73._8_4_;
                          fVar246 = auVar74._12_4_ + auVar73._12_4_;
                          auVar74 = vsubps_avx(auVar65,auVar153);
                          fVar104 = auVar65._0_4_ + auVar153._0_4_;
                          fVar127 = auVar65._4_4_ + auVar153._4_4_;
                          fVar128 = auVar65._8_4_ + auVar153._8_4_;
                          fVar129 = auVar65._12_4_ + auVar153._12_4_;
                          fVar227 = auVar74._0_4_;
                          auVar158._0_4_ = fVar227 * fVar239;
                          fVar213 = auVar74._4_4_;
                          auVar158._4_4_ = fVar213 * fVar243;
                          fVar215 = auVar74._8_4_;
                          auVar158._8_4_ = fVar215 * fVar244;
                          fVar218 = auVar74._12_4_;
                          auVar158._12_4_ = fVar218 * fVar246;
                          fVar173 = auVar152._0_4_;
                          auVar194._0_4_ = fVar173 * fVar104;
                          fVar184 = auVar152._4_4_;
                          auVar194._4_4_ = fVar184 * fVar127;
                          fVar187 = auVar152._8_4_;
                          auVar194._8_4_ = fVar187 * fVar128;
                          fVar220 = auVar152._12_4_;
                          auVar194._12_4_ = fVar220 * fVar129;
                          auVar74 = vsubps_avx(auVar194,auVar158);
                          fVar264 = auVar66._0_4_;
                          auVar108._0_4_ = fVar264 * fVar104;
                          fVar104 = auVar66._4_4_;
                          auVar108._4_4_ = fVar104 * fVar127;
                          fVar127 = auVar66._8_4_;
                          auVar108._8_4_ = fVar127 * fVar128;
                          fVar128 = auVar66._12_4_;
                          auVar108._12_4_ = fVar128 * fVar129;
                          auVar195._0_4_ = fVar227 * fVar237;
                          auVar195._4_4_ = fVar213 * fVar238;
                          auVar195._8_4_ = fVar215 * fVar186;
                          auVar195._12_4_ = fVar218 * fVar189;
                          auVar65 = vsubps_avx(auVar195,auVar108);
                          auVar59._0_4_ = fVar237 * fVar173;
                          auVar59._4_4_ = fVar238 * fVar184;
                          auVar59._8_4_ = fVar186 * fVar187;
                          auVar59._12_4_ = fVar189 * fVar220;
                          auVar85._0_4_ = fVar264 * fVar239;
                          auVar85._4_4_ = fVar104 * fVar243;
                          auVar85._8_4_ = fVar127 * fVar244;
                          auVar85._12_4_ = fVar128 * fVar246;
                          auVar152 = vsubps_avx(auVar85,auVar59);
                          auVar132._8_4_ = 0x7fffffff;
                          auVar132._0_8_ = 0x7fffffff7fffffff;
                          auVar132._12_4_ = 0x7fffffff;
                          auVar60._0_4_ =
                               fVar202 * auVar74._0_4_ +
                               auVar152._0_4_ * (float)local_1c58._0_4_ + local_1c48 * auVar65._0_4_
                          ;
                          auVar60._4_4_ =
                               fVar203 * auVar74._4_4_ +
                               auVar152._4_4_ * (float)local_1c58._4_4_ +
                               fStack_1c44 * auVar65._4_4_;
                          auVar60._8_4_ =
                               fVar217 * auVar74._8_4_ +
                               auVar152._8_4_ * fStack_1c50 + fStack_1c40 * auVar65._8_4_;
                          auVar60._12_4_ =
                               fVar235 * auVar74._12_4_ +
                               auVar152._12_4_ * fVar190 + fVar201 * auVar65._12_4_;
                          auVar147._0_4_ = auVar60._0_4_ + fVar230 + (float)local_1b88._0_4_;
                          auVar147._4_4_ = auVar60._4_4_ + fVar236 + (float)local_1b88._4_4_;
                          auVar147._8_4_ = auVar60._8_4_ + auVar232._8_4_ + fStack_1b80;
                          auVar147._12_4_ = auVar60._12_4_ + auVar232._12_4_ + fStack_1b7c;
                          auVar74 = vandps_avx(auVar147,auVar132);
                          auVar86._0_4_ = auVar74._0_4_ * 1.1920929e-07;
                          auVar86._4_4_ = auVar74._4_4_ * 1.1920929e-07;
                          auVar86._8_4_ = auVar74._8_4_ * 1.1920929e-07;
                          auVar86._12_4_ = auVar74._12_4_ * 1.1920929e-07;
                          auVar74 = vminps_avx(auVar232,_local_1b88);
                          auVar74 = vminps_avx(auVar74,auVar60);
                          uVar40 = CONCAT44(auVar86._4_4_,auVar86._0_4_);
                          auVar159._0_8_ = uVar40 ^ 0x8000000080000000;
                          auVar159._8_4_ = -auVar86._8_4_;
                          auVar159._12_4_ = -auVar86._12_4_;
                          auVar74 = vcmpps_avx(auVar74,auVar159,5);
                          auVar65 = vmaxps_avx(auVar232,_local_1b88);
                          auVar65 = vmaxps_avx(auVar65,auVar60);
                          auVar65 = vcmpps_avx(auVar65,auVar86,2);
                          auVar74 = vorps_avx(auVar74,auVar65);
                          auVar65 = auVar83 & auVar74;
                          auVar74 = vandps_avx(auVar74,auVar83);
                          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar65 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar65[0xf] < '\0') {
                            auVar61._0_4_ = fVar245 * fVar55;
                            auVar61._4_4_ = fVar247 * fVar78;
                            auVar61._8_4_ = fVar249 * fVar4;
                            auVar61._12_4_ = fVar250 * fVar185;
                            auVar87._0_4_ = fVar257 * fVar76;
                            auVar87._4_4_ = fVar258 * fVar3;
                            auVar87._8_4_ = fVar259 * fVar216;
                            auVar87._12_4_ = fVar262 * fVar188;
                            auVar73 = vsubps_avx(auVar87,auVar61);
                            auVar109._0_4_ = fVar257 * fVar173;
                            auVar109._4_4_ = fVar258 * fVar184;
                            auVar109._8_4_ = fVar259 * fVar187;
                            auVar109._12_4_ = fVar262 * fVar220;
                            auVar160._0_4_ = fVar245 * fVar227;
                            auVar160._4_4_ = fVar247 * fVar213;
                            auVar160._8_4_ = fVar249 * fVar215;
                            auVar160._12_4_ = fVar250 * fVar218;
                            auVar153 = vsubps_avx(auVar160,auVar109);
                            auVar65 = vandps_avx(auVar61,auVar132);
                            auVar152 = vandps_avx(auVar109,auVar132);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar73 = vblendvps_avx(auVar153,auVar73,auVar65);
                            auVar62._0_4_ = fVar251 * fVar227;
                            auVar62._4_4_ = fVar254 * fVar213;
                            auVar62._8_4_ = fVar255 * fVar215;
                            auVar62._12_4_ = fVar256 * fVar218;
                            auVar88._0_4_ = fVar251 * fVar55;
                            auVar88._4_4_ = fVar254 * fVar78;
                            auVar88._8_4_ = fVar255 * fVar4;
                            auVar88._12_4_ = fVar256 * fVar185;
                            auVar148._0_4_ = fVar257 * fVar77;
                            auVar148._4_4_ = fVar258 * fVar204;
                            auVar148._8_4_ = fVar259 * fVar212;
                            auVar148._12_4_ = fVar262 * fVar214;
                            auVar153 = vsubps_avx(auVar88,auVar148);
                            auVar161._0_4_ = fVar264 * fVar257;
                            auVar161._4_4_ = fVar104 * fVar258;
                            auVar161._8_4_ = fVar127 * fVar259;
                            auVar161._12_4_ = fVar128 * fVar262;
                            auVar66 = vsubps_avx(auVar161,auVar62);
                            auVar65 = vandps_avx(auVar132,auVar148);
                            auVar152 = vandps_avx(auVar132,auVar62);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar153 = vblendvps_avx(auVar66,auVar153,auVar65);
                            auVar63._0_4_ = fVar264 * fVar245;
                            auVar63._4_4_ = fVar104 * fVar247;
                            auVar63._8_4_ = fVar127 * fVar249;
                            auVar63._12_4_ = fVar128 * fVar250;
                            auVar89._0_4_ = fVar245 * fVar77;
                            auVar89._4_4_ = fVar247 * fVar204;
                            auVar89._8_4_ = fVar249 * fVar212;
                            auVar89._12_4_ = fVar250 * fVar214;
                            auVar162._0_4_ = fVar251 * fVar76;
                            auVar162._4_4_ = fVar254 * fVar3;
                            auVar162._8_4_ = fVar255 * fVar216;
                            auVar162._12_4_ = fVar256 * fVar188;
                            auVar196._0_4_ = fVar251 * fVar173;
                            auVar196._4_4_ = fVar254 * fVar184;
                            auVar196._8_4_ = fVar255 * fVar187;
                            auVar196._12_4_ = fVar256 * fVar220;
                            auVar66 = vsubps_avx(auVar89,auVar162);
                            auVar12 = vsubps_avx(auVar196,auVar63);
                            auVar65 = vandps_avx(auVar132,auVar162);
                            auVar152 = vandps_avx(auVar132,auVar63);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar152 = vblendvps_avx(auVar12,auVar66,auVar65);
                            local_1c18 = auVar19._0_4_;
                            fStack_1c14 = auVar19._4_4_;
                            fStack_1c10 = auVar19._8_4_;
                            fVar55 = auVar73._0_4_ * local_1c18 +
                                     auVar152._0_4_ * (float)local_1c58._0_4_ +
                                     auVar153._0_4_ * local_1c48;
                            fVar76 = auVar73._4_4_ * fStack_1c14 +
                                     auVar152._4_4_ * (float)local_1c58._4_4_ +
                                     auVar153._4_4_ * fStack_1c44;
                            fVar77 = auVar73._8_4_ * fStack_1c10 +
                                     auVar152._8_4_ * fStack_1c50 + auVar153._8_4_ * fStack_1c40;
                            fVar78 = auVar73._12_4_ * fVar235 +
                                     auVar152._12_4_ * fVar190 + auVar153._12_4_ * fVar201;
                            auVar64._0_4_ = fVar55 + fVar55;
                            auVar64._4_4_ = fVar76 + fVar76;
                            auVar64._8_4_ = fVar77 + fVar77;
                            auVar64._12_4_ = fVar78 + fVar78;
                            fVar55 = auVar73._0_4_ * fVar219 +
                                     auVar152._0_4_ * fVar10 + auVar153._0_4_ * fVar263;
                            fVar76 = auVar73._4_4_ * fVar226 +
                                     auVar152._4_4_ * fVar11 + auVar153._4_4_ * fVar265;
                            fVar77 = auVar73._8_4_ * fVar228 +
                                     auVar152._8_4_ * fVar103 + auVar153._8_4_ * fVar266;
                            fVar78 = auVar73._12_4_ * fVar229 +
                                     auVar152._12_4_ * fVar126 + auVar153._12_4_ * fVar270;
                            auVar65 = vrcpps_avx(auVar64);
                            fVar10 = auVar65._0_4_;
                            auVar197._0_4_ = auVar64._0_4_ * fVar10;
                            fVar11 = auVar65._4_4_;
                            auVar197._4_4_ = auVar64._4_4_ * fVar11;
                            fVar103 = auVar65._8_4_;
                            auVar197._8_4_ = auVar64._8_4_ * fVar103;
                            fVar126 = auVar65._12_4_;
                            auVar197._12_4_ = auVar64._12_4_ * fVar126;
                            auVar223._8_4_ = 0x3f800000;
                            auVar223._0_8_ = 0x3f8000003f800000;
                            auVar223._12_4_ = 0x3f800000;
                            auVar65 = vsubps_avx(auVar223,auVar197);
                            auVar90._0_4_ = (fVar55 + fVar55) * (fVar10 + fVar10 * auVar65._0_4_);
                            auVar90._4_4_ = (fVar76 + fVar76) * (fVar11 + fVar11 * auVar65._4_4_);
                            auVar90._8_4_ = (fVar77 + fVar77) * (fVar103 + fVar103 * auVar65._8_4_);
                            auVar90._12_4_ =
                                 (fVar78 + fVar78) * (fVar126 + fVar126 * auVar65._12_4_);
                            auVar65 = vcmpps_avx(auVar90,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar66 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar90,2);
                            auVar65 = vandps_avx(auVar66,auVar65);
                            auVar66 = vcmpps_avx(auVar64,_DAT_01f7aa10,4);
                            auVar65 = vandps_avx(auVar66,auVar65);
                            auVar65 = vpslld_avx(auVar65,0x1f);
                            auVar66 = vpsrad_avx(auVar65,0x1f);
                            auVar65 = auVar74 & auVar66;
                            auVar74 = vandps_avx(auVar74,auVar66);
                            if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar65 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar65[0xf] < '\0') {
                              uStack_16e0 = auVar232._8_8_;
                              uStack_1730 = uStack_16e0;
                              _local_1748 = _local_1b88;
                              local_1798 = auVar152;
                              local_1788 = auVar153;
                              local_1778 = auVar73;
                              local_1768 = auVar90;
                              local_1758 = auVar147;
                              local_1738 = auVar232._0_8_;
                            }
                          }
                          uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar50);
                          auVar242._4_4_ = uVar44;
                          auVar242._0_4_ = uVar44;
                          auVar242._8_4_ = uVar44;
                          auVar242._12_4_ = uVar44;
                          fVar10 = *(float *)(pGVar36->data + lVar47 + lVar32 + -0x30);
                          fVar11 = *(float *)(pGVar36->data + lVar47 + lVar31 + -0x30);
                          uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar29);
                          local_1b98._4_4_ = uVar44;
                          local_1b98._0_4_ = uVar44;
                          local_1b98._8_4_ = uVar44;
                          local_1b98._12_4_ = uVar44;
                          uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar27);
                          local_1ba8._4_4_ = uVar44;
                          local_1ba8._0_4_ = uVar44;
                          local_1ba8._8_4_ = uVar44;
                          local_1ba8._12_4_ = uVar44;
                          uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar25);
                          local_1bb8._4_4_ = uVar44;
                          local_1bb8._0_4_ = uVar44;
                          local_1bb8._8_4_ = uVar44;
                          local_1bb8._12_4_ = uVar44;
                          pGVar6 = (context->scene->geometries).items
                                   [(pre.super_Precalculations.grid)->_geomID].ptr;
                          uVar5 = pGVar6->mask;
                          auVar91._4_4_ = uVar5;
                          auVar91._0_4_ = uVar5;
                          auVar91._8_4_ = uVar5;
                          auVar91._12_4_ = uVar5;
                          auVar65 = vandps_avx(auVar91,*(undefined1 (*) [16])(ray + 0x90));
                          auVar65 = vpcmpeqd_avx(auVar65,_DAT_01f7aa10);
                          auVar152 = auVar74 & ~auVar65;
                          auVar73 = local_1b98;
                          auVar153 = local_1ba8;
                          auVar66 = local_1bb8;
                          if ((((auVar152 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar152 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar152 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar152[0xf] < '\0') {
                            auVar74 = vandnps_avx(auVar65,auVar74);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar65 = vandps_avx(local_1758,auVar132);
                              auVar152 = vrcpps_avx(local_1758);
                              fVar103 = auVar152._0_4_;
                              auVar136._0_4_ = local_1758._0_4_ * fVar103;
                              fVar126 = auVar152._4_4_;
                              auVar136._4_4_ = local_1758._4_4_ * fVar126;
                              fVar55 = auVar152._8_4_;
                              auVar136._8_4_ = local_1758._8_4_ * fVar55;
                              fVar76 = auVar152._12_4_;
                              auVar136._12_4_ = local_1758._12_4_ * fVar76;
                              auVar182._8_4_ = 0x3f800000;
                              auVar182._0_8_ = 0x3f8000003f800000;
                              auVar182._12_4_ = 0x3f800000;
                              auVar152 = vsubps_avx(auVar182,auVar136);
                              auVar116._0_4_ = fVar103 + fVar103 * auVar152._0_4_;
                              auVar116._4_4_ = fVar126 + fVar126 * auVar152._4_4_;
                              auVar116._8_4_ = fVar55 + fVar55 * auVar152._8_4_;
                              auVar116._12_4_ = fVar76 + fVar76 * auVar152._12_4_;
                              auVar137._8_4_ = 0x219392ef;
                              auVar137._0_8_ = 0x219392ef219392ef;
                              auVar137._12_4_ = 0x219392ef;
                              auVar65 = vcmpps_avx(auVar65,auVar137,5);
                              auVar65 = vandps_avx(auVar65,auVar116);
                              auVar97._0_4_ = auVar65._0_4_ * (float)local_1738;
                              auVar97._4_4_ = auVar65._4_4_ * local_1738._4_4_;
                              auVar97._8_4_ = auVar65._8_4_ * (float)uStack_1730;
                              auVar97._12_4_ = auVar65._12_4_ * uStack_1730._4_4_;
                              auVar221 = vminps_avx(auVar97,auVar182);
                              auVar117._0_4_ = auVar65._0_4_ * (float)local_1748._0_4_;
                              auVar117._4_4_ = auVar65._4_4_ * (float)local_1748._4_4_;
                              auVar117._8_4_ = auVar65._8_4_ * fStack_1740;
                              auVar117._12_4_ = auVar65._12_4_ * fStack_173c;
                              auVar66 = vminps_avx(auVar117,auVar182);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar24 + -4);
                              auVar138._4_4_ = uVar44;
                              auVar138._0_4_ = uVar44;
                              auVar138._8_4_ = uVar44;
                              auVar138._12_4_ = uVar44;
                              auVar152 = vpsrld_avx(auVar138,0x10);
                              auVar73 = ZEXT816(0) << 0x40;
                              auVar65 = vpblendw_avx(auVar138,auVar73,0xaa);
                              auVar65 = vcvtdq2ps_avx(auVar65);
                              auVar152 = vcvtdq2ps_avx(auVar152);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar23 + -4);
                              auVar168._4_4_ = uVar44;
                              auVar168._0_4_ = uVar44;
                              auVar168._8_4_ = uVar44;
                              auVar168._12_4_ = uVar44;
                              auVar174 = vsubps_avx(auVar182,auVar221);
                              auVar12 = vsubps_avx(auVar174,auVar66);
                              auVar174 = vpblendw_avx(auVar168,auVar73,0xaa);
                              auVar174 = vcvtdq2ps_avx(auVar174);
                              auVar171 = vpsrld_avx(auVar168,0x10);
                              auVar171 = vcvtdq2ps_avx(auVar171);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar24);
                              auVar169._4_4_ = uVar44;
                              auVar169._0_4_ = uVar44;
                              auVar169._8_4_ = uVar44;
                              auVar169._12_4_ = uVar44;
                              auVar73 = vpblendw_avx(auVar169,auVar73,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar153 = vpsrld_avx(auVar169,0x10);
                              auVar153 = vcvtdq2ps_avx(auVar153);
                              local_19d8 = local_1778._0_8_;
                              uStack_19d0 = local_1778._8_8_;
                              local_19c8 = local_1788._0_8_;
                              uStack_19c0 = local_1788._8_8_;
                              local_19b8 = local_1798._0_8_;
                              uStack_19b0 = local_1798._8_8_;
                              local_19a8 = auVar221._0_4_ * auVar73._0_4_ * 0.00012207031 +
                                           auVar12._0_4_ * auVar65._0_4_ * 0.00012207031 +
                                           auVar66._0_4_ * auVar174._0_4_ * 0.00012207031;
                              fStack_19a4 = auVar221._4_4_ * auVar73._4_4_ * 0.00012207031 +
                                            auVar12._4_4_ * auVar65._4_4_ * 0.00012207031 +
                                            auVar66._4_4_ * auVar174._4_4_ * 0.00012207031;
                              fStack_19a0 = auVar221._8_4_ * auVar73._8_4_ * 0.00012207031 +
                                            auVar12._8_4_ * auVar65._8_4_ * 0.00012207031 +
                                            auVar66._8_4_ * auVar174._8_4_ * 0.00012207031;
                              fStack_199c = auVar221._12_4_ * auVar73._12_4_ * 0.00012207031 +
                                            auVar12._12_4_ * auVar65._12_4_ * 0.00012207031 +
                                            auVar66._12_4_ * auVar174._12_4_ * 0.00012207031;
                              local_1978 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->
                                                               _geomID),0);
                              local_1998 = auVar221._0_4_ * auVar153._0_4_ * 0.00012207031 +
                                           auVar12._0_4_ * auVar152._0_4_ * 0.00012207031 +
                                           auVar66._0_4_ * auVar171._0_4_ * 0.00012207031;
                              fStack_1994 = auVar221._4_4_ * auVar153._4_4_ * 0.00012207031 +
                                            auVar12._4_4_ * auVar152._4_4_ * 0.00012207031 +
                                            auVar66._4_4_ * auVar171._4_4_ * 0.00012207031;
                              fStack_1990 = auVar221._8_4_ * auVar153._8_4_ * 0.00012207031 +
                                            auVar12._8_4_ * auVar152._8_4_ * 0.00012207031 +
                                            auVar66._8_4_ * auVar171._8_4_ * 0.00012207031;
                              fStack_198c = auVar221._12_4_ * auVar153._12_4_ * 0.00012207031 +
                                            auVar12._12_4_ * auVar152._12_4_ * 0.00012207031 +
                                            auVar66._12_4_ * auVar171._12_4_ * 0.00012207031;
                              local_1988 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->
                                                               _primID),0);
                              vcmpps_avx(ZEXT1632((undefined1  [16])0x0),
                                         ZEXT1632((undefined1  [16])0x0),0xf);
                              uStack_1964 = context->user->instID[0];
                              local_1968 = uStack_1964;
                              uStack_1960 = uStack_1964;
                              uStack_195c = uStack_1964;
                              uStack_1958 = context->user->instPrimID[0];
                              uStack_1954 = uStack_1958;
                              uStack_1950 = uStack_1958;
                              uStack_194c = uStack_1958;
                              local_1bc8 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar65 = vblendvps_avx(local_1bc8,local_1768,auVar74);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar65;
                              args.valid = (int *)local_1bf8;
                              args.geometryUserPtr = pGVar6->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_19d8;
                              args.N = 4;
                              local_1bf8 = auVar74;
                              _local_1b88 = auVar242;
                              args.ray = (RTCRayN *)ray;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&args);
                              }
                              if (local_1bf8 == (undefined1  [16])0x0) {
                                auVar74 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar74 = auVar74 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&args);
                                }
                                auVar65 = vpcmpeqd_avx(local_1bf8,_DAT_01f7aa10);
                                auVar74 = auVar65 ^ _DAT_01f7ae20;
                                auVar118._8_4_ = 0xff800000;
                                auVar118._0_8_ = 0xff800000ff800000;
                                auVar118._12_4_ = 0xff800000;
                                auVar65 = vblendvps_avx(auVar118,*(undefined1 (*) [16])
                                                                  (args.ray + 0x80),auVar65);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar65;
                              }
                              auVar65 = vpslld_avx(auVar74,0x1f);
                              auVar74 = vpsrad_avx(auVar65,0x1f);
                              auVar65 = vblendvps_avx(local_1bc8,*(undefined1 (*) [16])local_1be0,
                                                      auVar65);
                              *(undefined1 (*) [16])local_1be0 = auVar65;
                              auVar221 = local_1bb8;
                              auVar171 = local_1ba8;
                              auVar174 = local_1b98;
                              auVar73 = local_1b98;
                              auVar153 = local_1ba8;
                              auVar66 = local_1bb8;
                              auVar242 = _local_1b88;
                            }
                            local_1b98 = auVar174;
                            local_1ba8 = auVar171;
                            local_1bb8 = auVar221;
                            auVar83 = vpandn_avx(auVar74,auVar83);
                            auVar221 = local_1bb8;
                            auVar171 = local_1ba8;
                            auVar174 = local_1b98;
                          }
                          local_1b98 = auVar174;
                          local_1ba8 = auVar171;
                          local_1bb8 = auVar221;
                          auVar125 = ZEXT1664(auVar83);
                          if ((((auVar83 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               && (auVar83 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar83 >> 0x5f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) && -1 < auVar83[0xf]) break;
                          auVar248._0_4_ = auVar242._0_4_ * local_1a08 + auVar73._0_4_ * local_19f8;
                          auVar248._4_4_ =
                               auVar242._4_4_ * fStack_1a04 + auVar73._4_4_ * fStack_19f4;
                          auVar248._8_4_ =
                               auVar242._8_4_ * fStack_1a00 + auVar73._8_4_ * fStack_19f0;
                          auVar248._12_4_ =
                               auVar242._12_4_ * fStack_19fc + auVar73._12_4_ * fStack_19ec;
                          auVar163._0_4_ = fVar10 * local_1a08 + auVar153._0_4_ * local_19f8;
                          auVar163._4_4_ = fVar10 * fStack_1a04 + auVar153._4_4_ * fStack_19f4;
                          auVar163._8_4_ = fVar10 * fStack_1a00 + auVar153._8_4_ * fStack_19f0;
                          auVar163._12_4_ = fVar10 * fStack_19fc + auVar153._12_4_ * fStack_19ec;
                          auVar179._0_4_ = fVar11 * local_1a08 + auVar66._0_4_ * local_19f8;
                          auVar179._4_4_ = fVar11 * fStack_1a04 + auVar66._4_4_ * fStack_19f4;
                          auVar179._8_4_ = fVar11 * fStack_1a00 + auVar66._8_4_ * fStack_19f0;
                          auVar179._12_4_ = fVar11 * fStack_19fc + auVar66._12_4_ * fStack_19ec;
                          auVar74 = *(undefined1 (*) [16])ray;
                          auVar65 = *(undefined1 (*) [16])(ray + 0x10);
                          auVar152 = *(undefined1 (*) [16])(ray + 0x20);
                          auVar174 = vsubps_avx(auVar231,auVar74);
                          auVar171 = vsubps_avx(auVar57,auVar65);
                          _local_1b88 = vsubps_avx(auVar84,auVar152);
                          auVar73 = vsubps_avx(_local_1b78,auVar74);
                          auVar16._4_4_ = fVar100;
                          auVar16._0_4_ = fVar79;
                          auVar16._8_4_ = fVar101;
                          auVar16._12_4_ = fVar102;
                          auVar153 = vsubps_avx(auVar16,auVar65);
                          auVar221 = vsubps_avx(_local_1ae8,auVar152);
                          auVar74 = vsubps_avx(auVar248,auVar74);
                          auVar65 = vsubps_avx(auVar163,auVar65);
                          auVar152 = vsubps_avx(auVar179,auVar152);
                          local_1b98 = vsubps_avx(auVar74,auVar174);
                          local_1ba8 = vsubps_avx(auVar65,auVar171);
                          local_1bb8 = vsubps_avx(auVar152,_local_1b88);
                          fVar249 = auVar171._0_4_;
                          fVar212 = fVar249 + auVar65._0_4_;
                          fVar251 = auVar171._4_4_;
                          fVar185 = fVar251 + auVar65._4_4_;
                          fVar255 = auVar171._8_4_;
                          fVar188 = fVar255 + auVar65._8_4_;
                          fVar257 = auVar171._12_4_;
                          fVar214 = fVar257 + auVar65._12_4_;
                          fVar265 = local_1b88._0_4_;
                          fVar78 = fVar265 + auVar152._0_4_;
                          fVar270 = local_1b88._4_4_;
                          fVar204 = fVar270 + auVar152._4_4_;
                          fVar271 = local_1b88._8_4_;
                          fVar216 = fVar271 + auVar152._8_4_;
                          fVar272 = local_1b88._12_4_;
                          fVar190 = fVar272 + auVar152._12_4_;
                          fVar259 = local_1bb8._0_4_;
                          auVar224._0_4_ = fVar259 * fVar212;
                          fVar262 = local_1bb8._4_4_;
                          auVar224._4_4_ = fVar262 * fVar185;
                          fVar263 = local_1bb8._8_4_;
                          auVar224._8_4_ = fVar263 * fVar188;
                          fVar264 = local_1bb8._12_4_;
                          auVar224._12_4_ = fVar264 * fVar214;
                          fVar55 = local_1ba8._0_4_;
                          auVar233._0_4_ = fVar78 * fVar55;
                          fVar77 = local_1ba8._4_4_;
                          auVar233._4_4_ = fVar204 * fVar77;
                          fVar3 = local_1ba8._8_4_;
                          auVar233._8_4_ = fVar216 * fVar3;
                          fVar4 = local_1ba8._12_4_;
                          auVar233._12_4_ = fVar190 * fVar4;
                          auVar66 = vsubps_avx(auVar233,auVar224);
                          fVar10 = auVar174._0_4_;
                          fVar201 = auVar74._0_4_ + fVar10;
                          fVar11 = auVar174._4_4_;
                          fVar202 = auVar74._4_4_ + fVar11;
                          fVar103 = auVar174._8_4_;
                          fVar203 = auVar74._8_4_ + fVar103;
                          fVar126 = auVar174._12_4_;
                          fVar217 = auVar74._12_4_ + fVar126;
                          fVar76 = local_1b98._0_4_;
                          auVar209._0_4_ = fVar78 * fVar76;
                          fVar78 = local_1b98._4_4_;
                          auVar209._4_4_ = fVar204 * fVar78;
                          fVar204 = local_1b98._8_4_;
                          auVar209._8_4_ = fVar216 * fVar204;
                          fVar216 = local_1b98._12_4_;
                          auVar209._12_4_ = fVar190 * fVar216;
                          auVar234._0_4_ = fVar201 * fVar259;
                          auVar234._4_4_ = fVar202 * fVar262;
                          auVar234._8_4_ = fVar203 * fVar263;
                          auVar234._12_4_ = fVar217 * fVar264;
                          auVar12 = vsubps_avx(auVar234,auVar209);
                          auVar210._0_4_ = fVar201 * fVar55;
                          auVar210._4_4_ = fVar202 * fVar77;
                          auVar210._8_4_ = fVar203 * fVar3;
                          auVar210._12_4_ = fVar217 * fVar4;
                          auVar180._0_4_ = fVar76 * fVar212;
                          auVar180._4_4_ = fVar78 * fVar185;
                          auVar180._8_4_ = fVar204 * fVar188;
                          auVar180._12_4_ = fVar216 * fVar214;
                          auVar13 = vsubps_avx(auVar180,auVar210);
                          fVar212 = *(float *)(ray + 0x60);
                          fVar185 = *(float *)(ray + 100);
                          fVar188 = *(float *)(ray + 0x68);
                          auVar18 = *(undefined1 (*) [12])(ray + 0x60);
                          fVar214 = *(float *)(ray + 0x6c);
                          fVar190 = *(float *)(ray + 0x50);
                          fVar201 = *(float *)(ray + 0x54);
                          fVar202 = *(float *)(ray + 0x58);
                          auVar19 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar203 = *(float *)(ray + 0x5c);
                          auVar17 = *(undefined1 (*) [12])(ray + 0x40);
                          fVar217 = *(float *)(ray + 0x4c);
                          fVar220 = auVar66._0_4_ * *(float *)(ray + 0x40) +
                                    fVar190 * auVar12._0_4_ + auVar13._0_4_ * fVar212;
                          fVar227 = auVar66._4_4_ * *(float *)(ray + 0x44) +
                                    fVar201 * auVar12._4_4_ + auVar13._4_4_ * fVar185;
                          local_1b78 = (undefined1  [8])CONCAT44(fVar227,fVar220);
                          uStack_1b70._0_4_ =
                               auVar66._8_4_ * *(float *)(ray + 0x48) +
                               fVar202 * auVar12._8_4_ + auVar13._8_4_ * fVar188;
                          uStack_1b70._4_4_ =
                               auVar66._12_4_ * fVar217 +
                               fVar203 * auVar12._12_4_ + auVar13._12_4_ * fVar214;
                          local_1bc8 = vsubps_avx(auVar171,auVar153);
                          auVar171 = vsubps_avx(_local_1b88,auVar221);
                          fVar235 = fVar249 + auVar153._0_4_;
                          fVar237 = fVar251 + auVar153._4_4_;
                          fVar238 = fVar255 + auVar153._8_4_;
                          fVar186 = fVar257 + auVar153._12_4_;
                          fVar189 = fVar265 + auVar221._0_4_;
                          fVar79 = fVar270 + auVar221._4_4_;
                          fVar239 = fVar271 + auVar221._8_4_;
                          fVar100 = fVar272 + auVar221._12_4_;
                          fVar230 = auVar171._0_4_;
                          auVar253._0_4_ = fVar230 * fVar235;
                          fVar236 = auVar171._4_4_;
                          auVar253._4_4_ = fVar236 * fVar237;
                          fVar245 = auVar171._8_4_;
                          auVar253._8_4_ = fVar245 * fVar238;
                          fVar247 = auVar171._12_4_;
                          auVar253._12_4_ = fVar247 * fVar186;
                          fVar213 = local_1bc8._0_4_;
                          auVar110._0_4_ = fVar213 * fVar189;
                          fVar218 = local_1bc8._4_4_;
                          auVar110._4_4_ = fVar218 * fVar79;
                          fVar226 = local_1bc8._8_4_;
                          auVar110._8_4_ = fVar226 * fVar239;
                          fVar229 = local_1bc8._12_4_;
                          auVar110._12_4_ = fVar229 * fVar100;
                          auVar171 = vsubps_avx(auVar110,auVar253);
                          auVar174 = vsubps_avx(auVar174,auVar73);
                          fVar250 = auVar174._0_4_;
                          auVar269._0_4_ = fVar250 * fVar189;
                          fVar254 = auVar174._4_4_;
                          auVar269._4_4_ = fVar254 * fVar79;
                          fVar256 = auVar174._8_4_;
                          auVar269._8_4_ = fVar256 * fVar239;
                          fVar258 = auVar174._12_4_;
                          auVar269._12_4_ = fVar258 * fVar100;
                          fVar189 = auVar73._0_4_ + fVar10;
                          fVar79 = auVar73._4_4_ + fVar11;
                          fVar239 = auVar73._8_4_ + fVar103;
                          fVar100 = auVar73._12_4_ + fVar126;
                          auVar211._0_4_ = fVar230 * fVar189;
                          auVar211._4_4_ = fVar236 * fVar79;
                          auVar211._8_4_ = fVar245 * fVar239;
                          auVar211._12_4_ = fVar247 * fVar100;
                          auVar174 = vsubps_avx(auVar211,auVar269);
                          auVar198._0_4_ = fVar213 * fVar189;
                          auVar198._4_4_ = fVar218 * fVar79;
                          auVar198._8_4_ = fVar226 * fVar239;
                          auVar198._12_4_ = fVar229 * fVar100;
                          auVar181._0_4_ = fVar250 * fVar235;
                          auVar181._4_4_ = fVar254 * fVar237;
                          auVar181._8_4_ = fVar256 * fVar238;
                          auVar181._12_4_ = fVar258 * fVar186;
                          auVar66 = vsubps_avx(auVar181,auVar198);
                          fVar215 = auVar17._0_4_;
                          fVar219 = auVar17._4_4_;
                          fVar228 = auVar17._8_4_;
                          auVar199._0_4_ =
                               fVar215 * auVar171._0_4_ +
                               auVar66._0_4_ * fVar212 + fVar190 * auVar174._0_4_;
                          auVar199._4_4_ =
                               fVar219 * auVar171._4_4_ +
                               auVar66._4_4_ * fVar185 + fVar201 * auVar174._4_4_;
                          auVar199._8_4_ =
                               fVar228 * auVar171._8_4_ +
                               auVar66._8_4_ * fVar188 + fVar202 * auVar174._8_4_;
                          auVar199._12_4_ =
                               fVar217 * auVar171._12_4_ +
                               auVar66._12_4_ * fVar214 + fVar203 * auVar174._12_4_;
                          auVar174 = vsubps_avx(auVar73,auVar74);
                          fVar189 = auVar73._0_4_ + auVar74._0_4_;
                          fVar79 = auVar73._4_4_ + auVar74._4_4_;
                          fVar239 = auVar73._8_4_ + auVar74._8_4_;
                          fVar100 = auVar73._12_4_ + auVar74._12_4_;
                          auVar74 = vsubps_avx(auVar153,auVar65);
                          fVar235 = auVar153._0_4_ + auVar65._0_4_;
                          fVar237 = auVar153._4_4_ + auVar65._4_4_;
                          fVar238 = auVar153._8_4_ + auVar65._8_4_;
                          fVar186 = auVar153._12_4_ + auVar65._12_4_;
                          auVar65 = vsubps_avx(auVar221,auVar152);
                          fVar243 = auVar221._0_4_ + auVar152._0_4_;
                          fVar101 = auVar221._4_4_ + auVar152._4_4_;
                          fVar244 = auVar221._8_4_ + auVar152._8_4_;
                          fVar102 = auVar221._12_4_ + auVar152._12_4_;
                          fVar129 = auVar65._0_4_;
                          auVar133._0_4_ = fVar129 * fVar235;
                          fVar173 = auVar65._4_4_;
                          auVar133._4_4_ = fVar173 * fVar237;
                          fVar184 = auVar65._8_4_;
                          auVar133._8_4_ = fVar184 * fVar238;
                          fVar187 = auVar65._12_4_;
                          auVar133._12_4_ = fVar187 * fVar186;
                          fVar246 = auVar74._0_4_;
                          auVar164._0_4_ = fVar246 * fVar243;
                          fVar104 = auVar74._4_4_;
                          auVar164._4_4_ = fVar104 * fVar101;
                          fVar127 = auVar74._8_4_;
                          auVar164._8_4_ = fVar127 * fVar244;
                          fVar128 = auVar74._12_4_;
                          auVar164._12_4_ = fVar128 * fVar102;
                          auVar74 = vsubps_avx(auVar164,auVar133);
                          fVar266 = auVar174._0_4_;
                          auVar111._0_4_ = fVar266 * fVar243;
                          fVar243 = auVar174._4_4_;
                          auVar111._4_4_ = fVar243 * fVar101;
                          fVar101 = auVar174._8_4_;
                          auVar111._8_4_ = fVar101 * fVar244;
                          fVar244 = auVar174._12_4_;
                          auVar111._12_4_ = fVar244 * fVar102;
                          auVar165._0_4_ = fVar129 * fVar189;
                          auVar165._4_4_ = fVar173 * fVar79;
                          auVar165._8_4_ = fVar184 * fVar239;
                          auVar165._12_4_ = fVar187 * fVar100;
                          auVar65 = vsubps_avx(auVar165,auVar111);
                          auVar92._0_4_ = fVar189 * fVar246;
                          auVar92._4_4_ = fVar79 * fVar104;
                          auVar92._8_4_ = fVar239 * fVar127;
                          auVar92._12_4_ = fVar100 * fVar128;
                          auVar67._0_4_ = fVar266 * fVar235;
                          auVar67._4_4_ = fVar243 * fVar237;
                          auVar67._8_4_ = fVar101 * fVar238;
                          auVar67._12_4_ = fVar244 * fVar186;
                          auVar152 = vsubps_avx(auVar67,auVar92);
                          auVar149._8_4_ = 0x7fffffff;
                          auVar149._0_8_ = 0x7fffffff7fffffff;
                          auVar149._12_4_ = 0x7fffffff;
                          auVar68._0_4_ =
                               fVar215 * auVar74._0_4_ +
                               auVar152._0_4_ * fVar212 + fVar190 * auVar65._0_4_;
                          auVar68._4_4_ =
                               fVar219 * auVar74._4_4_ +
                               auVar152._4_4_ * fVar185 + fVar201 * auVar65._4_4_;
                          auVar68._8_4_ =
                               fVar228 * auVar74._8_4_ +
                               auVar152._8_4_ * fVar188 + fVar202 * auVar65._8_4_;
                          auVar68._12_4_ =
                               fVar217 * auVar74._12_4_ +
                               auVar152._12_4_ * fVar214 + fVar203 * auVar65._12_4_;
                          auVar166._0_4_ = auVar68._0_4_ + fVar220 + auVar199._0_4_;
                          auVar166._4_4_ = auVar68._4_4_ + fVar227 + auVar199._4_4_;
                          auVar166._8_4_ = auVar68._8_4_ + (float)uStack_1b70 + auVar199._8_4_;
                          auVar166._12_4_ = auVar68._12_4_ + uStack_1b70._4_4_ + auVar199._12_4_;
                          auVar74 = vandps_avx(auVar166,auVar149);
                          auVar93._0_4_ = auVar74._0_4_ * 1.1920929e-07;
                          auVar93._4_4_ = auVar74._4_4_ * 1.1920929e-07;
                          auVar93._8_4_ = auVar74._8_4_ * 1.1920929e-07;
                          auVar93._12_4_ = auVar74._12_4_ * 1.1920929e-07;
                          auVar74 = vminps_avx(_local_1b78,auVar199);
                          auVar74 = vminps_avx(auVar74,auVar68);
                          uVar40 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
                          auVar134._0_8_ = uVar40 ^ 0x8000000080000000;
                          auVar134._8_4_ = -auVar93._8_4_;
                          auVar134._12_4_ = -auVar93._12_4_;
                          auVar74 = vcmpps_avx(auVar74,auVar134,5);
                          auVar65 = vmaxps_avx(_local_1b78,auVar199);
                          auVar65 = vmaxps_avx(auVar65,auVar68);
                          auVar65 = vcmpps_avx(auVar65,auVar93,2);
                          auVar74 = vorps_avx(auVar74,auVar65);
                          auVar65 = auVar83 & auVar74;
                          auVar74 = vandps_avx(auVar74,auVar83);
                          if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar65 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar65[0xf] < '\0') {
                            auVar69._0_4_ = fVar213 * fVar259;
                            auVar69._4_4_ = fVar218 * fVar262;
                            auVar69._8_4_ = fVar226 * fVar263;
                            auVar69._12_4_ = fVar229 * fVar264;
                            auVar94._0_4_ = fVar230 * fVar55;
                            auVar94._4_4_ = fVar236 * fVar77;
                            auVar94._8_4_ = fVar245 * fVar3;
                            auVar94._12_4_ = fVar247 * fVar4;
                            auVar174 = vsubps_avx(auVar94,auVar69);
                            auVar112._0_4_ = fVar230 * fVar246;
                            auVar112._4_4_ = fVar236 * fVar104;
                            auVar112._8_4_ = fVar245 * fVar127;
                            auVar112._12_4_ = fVar247 * fVar128;
                            auVar135._0_4_ = fVar213 * fVar129;
                            auVar135._4_4_ = fVar218 * fVar173;
                            auVar135._8_4_ = fVar226 * fVar184;
                            auVar135._12_4_ = fVar229 * fVar187;
                            auVar171 = vsubps_avx(auVar135,auVar112);
                            auVar65 = vandps_avx(auVar69,auVar149);
                            auVar152 = vandps_avx(auVar112,auVar149);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar174 = vblendvps_avx(auVar171,auVar174,auVar65);
                            auVar70._0_4_ = fVar250 * fVar129;
                            auVar70._4_4_ = fVar254 * fVar173;
                            auVar70._8_4_ = fVar256 * fVar184;
                            auVar70._12_4_ = fVar258 * fVar187;
                            auVar95._0_4_ = fVar250 * fVar259;
                            auVar95._4_4_ = fVar254 * fVar262;
                            auVar95._8_4_ = fVar256 * fVar263;
                            auVar95._12_4_ = fVar258 * fVar264;
                            auVar113._0_4_ = fVar230 * fVar76;
                            auVar113._4_4_ = fVar236 * fVar78;
                            auVar113._8_4_ = fVar245 * fVar204;
                            auVar113._12_4_ = fVar247 * fVar216;
                            auVar171 = vsubps_avx(auVar95,auVar113);
                            auVar150._0_4_ = fVar266 * fVar230;
                            auVar150._4_4_ = fVar243 * fVar236;
                            auVar150._8_4_ = fVar101 * fVar245;
                            auVar150._12_4_ = fVar244 * fVar247;
                            auVar73 = vsubps_avx(auVar150,auVar70);
                            auVar65 = vandps_avx(auVar149,auVar113);
                            auVar152 = vandps_avx(auVar149,auVar70);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar171 = vblendvps_avx(auVar73,auVar171,auVar65);
                            auVar71._0_4_ = fVar266 * fVar213;
                            auVar71._4_4_ = fVar243 * fVar218;
                            auVar71._8_4_ = fVar101 * fVar226;
                            auVar71._12_4_ = fVar244 * fVar229;
                            auVar114._0_4_ = fVar213 * fVar76;
                            auVar114._4_4_ = fVar218 * fVar78;
                            auVar114._8_4_ = fVar226 * fVar204;
                            auVar114._12_4_ = fVar229 * fVar216;
                            auVar151._0_4_ = fVar250 * fVar55;
                            auVar151._4_4_ = fVar254 * fVar77;
                            auVar151._8_4_ = fVar256 * fVar3;
                            auVar151._12_4_ = fVar258 * fVar4;
                            auVar167._0_4_ = fVar250 * fVar246;
                            auVar167._4_4_ = fVar254 * fVar104;
                            auVar167._8_4_ = fVar256 * fVar127;
                            auVar167._12_4_ = fVar258 * fVar128;
                            auVar73 = vsubps_avx(auVar114,auVar151);
                            auVar153 = vsubps_avx(auVar167,auVar71);
                            auVar65 = vandps_avx(auVar149,auVar151);
                            auVar152 = vandps_avx(auVar149,auVar71);
                            auVar65 = vcmpps_avx(auVar65,auVar152,1);
                            auVar152 = vblendvps_avx(auVar153,auVar73,auVar65);
                            local_1c58._0_4_ = auVar18._0_4_;
                            local_1c58._4_4_ = auVar18._4_4_;
                            fStack_1c50 = auVar18._8_4_;
                            local_1c48 = auVar19._0_4_;
                            fStack_1c44 = auVar19._4_4_;
                            fStack_1c40 = auVar19._8_4_;
                            fVar55 = fVar215 * auVar174._0_4_ +
                                     auVar152._0_4_ * (float)local_1c58._0_4_ +
                                     auVar171._0_4_ * local_1c48;
                            fVar76 = fVar219 * auVar174._4_4_ +
                                     auVar152._4_4_ * (float)local_1c58._4_4_ +
                                     auVar171._4_4_ * fStack_1c44;
                            fVar77 = fVar228 * auVar174._8_4_ +
                                     auVar152._8_4_ * fStack_1c50 + auVar171._8_4_ * fStack_1c40;
                            fVar78 = fVar217 * auVar174._12_4_ +
                                     auVar152._12_4_ * fVar214 + auVar171._12_4_ * fVar203;
                            auVar72._0_4_ = fVar55 + fVar55;
                            auVar72._4_4_ = fVar76 + fVar76;
                            auVar72._8_4_ = fVar77 + fVar77;
                            auVar72._12_4_ = fVar78 + fVar78;
                            fVar55 = auVar174._0_4_ * fVar10 +
                                     auVar152._0_4_ * fVar265 + auVar171._0_4_ * fVar249;
                            fVar76 = auVar174._4_4_ * fVar11 +
                                     auVar152._4_4_ * fVar270 + auVar171._4_4_ * fVar251;
                            fVar77 = auVar174._8_4_ * fVar103 +
                                     auVar152._8_4_ * fVar271 + auVar171._8_4_ * fVar255;
                            fVar78 = auVar174._12_4_ * fVar126 +
                                     auVar152._12_4_ * fVar272 + auVar171._12_4_ * fVar257;
                            auVar65 = vrcpps_avx(auVar72);
                            fVar10 = auVar65._0_4_;
                            auVar200._0_4_ = auVar72._0_4_ * fVar10;
                            fVar11 = auVar65._4_4_;
                            auVar200._4_4_ = auVar72._4_4_ * fVar11;
                            fVar103 = auVar65._8_4_;
                            auVar200._8_4_ = auVar72._8_4_ * fVar103;
                            fVar126 = auVar65._12_4_;
                            auVar200._12_4_ = auVar72._12_4_ * fVar126;
                            auVar225._8_4_ = 0x3f800000;
                            auVar225._0_8_ = 0x3f8000003f800000;
                            auVar225._12_4_ = 0x3f800000;
                            auVar65 = vsubps_avx(auVar225,auVar200);
                            auVar115._0_4_ = (fVar55 + fVar55) * (fVar10 + fVar10 * auVar65._0_4_);
                            auVar115._4_4_ = (fVar76 + fVar76) * (fVar11 + fVar11 * auVar65._4_4_);
                            auVar115._8_4_ = (fVar77 + fVar77) * (fVar103 + fVar103 * auVar65._8_4_)
                            ;
                            auVar115._12_4_ =
                                 (fVar78 + fVar78) * (fVar126 + fVar126 * auVar65._12_4_);
                            auVar65 = vcmpps_avx(auVar115,*(undefined1 (*) [16])(ray + 0x80),2);
                            auVar73 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar115,2);
                            auVar65 = vandps_avx(auVar73,auVar65);
                            auVar73 = vcmpps_avx(auVar72,_DAT_01f7aa10,4);
                            auVar65 = vandps_avx(auVar73,auVar65);
                            auVar65 = vpslld_avx(auVar65,0x1f);
                            auVar73 = vpsrad_avx(auVar65,0x1f);
                            auVar65 = auVar74 & auVar73;
                            auVar74 = vandps_avx(auVar73,auVar74);
                            if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar65 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar65[0xf] < '\0') {
                              uStack_17a0 = uStack_1b70;
                              local_1808 = auVar152;
                              local_17f8 = auVar171;
                              local_17e8 = auVar174;
                              local_17d8 = auVar115;
                              local_17c8 = auVar166;
                              _local_17b8 = auVar199;
                              local_17a8 = local_1b78;
                            }
                          }
                          pGVar6 = (context->scene->geometries).items
                                   [(pre.super_Precalculations.grid)->_geomID].ptr;
                          uVar5 = pGVar6->mask;
                          auVar96._4_4_ = uVar5;
                          auVar96._0_4_ = uVar5;
                          auVar96._8_4_ = uVar5;
                          auVar96._12_4_ = uVar5;
                          auVar65 = vandps_avx(auVar96,*(undefined1 (*) [16])(ray + 0x90));
                          auVar65 = vpcmpeqd_avx(auVar65,_DAT_01f7aa10);
                          auVar152 = auVar74 & ~auVar65;
                          if ((((auVar152 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar152 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar152 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar152[0xf] < '\0') {
                            auVar74 = vandnps_avx(auVar65,auVar74);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar65 = vandps_avx(local_17c8,auVar149);
                              auVar152 = vrcpps_avx(local_17c8);
                              fVar10 = auVar152._0_4_;
                              auVar139._0_4_ = local_17c8._0_4_ * fVar10;
                              fVar11 = auVar152._4_4_;
                              auVar139._4_4_ = local_17c8._4_4_ * fVar11;
                              fVar103 = auVar152._8_4_;
                              auVar139._8_4_ = local_17c8._8_4_ * fVar103;
                              fVar126 = auVar152._12_4_;
                              auVar139._12_4_ = local_17c8._12_4_ * fVar126;
                              auVar183._8_4_ = 0x3f800000;
                              auVar183._0_8_ = 0x3f8000003f800000;
                              auVar183._12_4_ = 0x3f800000;
                              auVar152 = vsubps_avx(auVar183,auVar139);
                              auVar119._0_4_ = fVar10 + fVar10 * auVar152._0_4_;
                              auVar119._4_4_ = fVar11 + fVar11 * auVar152._4_4_;
                              auVar119._8_4_ = fVar103 + fVar103 * auVar152._8_4_;
                              auVar119._12_4_ = fVar126 + fVar126 * auVar152._12_4_;
                              auVar140._8_4_ = 0x219392ef;
                              auVar140._0_8_ = 0x219392ef219392ef;
                              auVar140._12_4_ = 0x219392ef;
                              auVar65 = vcmpps_avx(auVar65,auVar140,5);
                              auVar65 = vandps_avx(auVar65,auVar119);
                              auVar98._0_4_ = auVar65._0_4_ * (float)local_17a8;
                              auVar98._4_4_ = auVar65._4_4_ * local_17a8._4_4_;
                              auVar98._8_4_ = auVar65._8_4_ * (float)uStack_17a0;
                              auVar98._12_4_ = auVar65._12_4_ * uStack_17a0._4_4_;
                              auVar221 = vminps_avx(auVar98,auVar183);
                              auVar120._0_4_ = auVar65._0_4_ * (float)local_17b8._0_4_;
                              auVar120._4_4_ = auVar65._4_4_ * (float)local_17b8._4_4_;
                              auVar120._8_4_ = auVar65._8_4_ * fStack_17b0;
                              auVar120._12_4_ = auVar65._12_4_ * fStack_17ac;
                              auVar66 = vminps_avx(auVar120,auVar183);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar23 + -4);
                              auVar141._4_4_ = uVar44;
                              auVar141._0_4_ = uVar44;
                              auVar141._8_4_ = uVar44;
                              auVar141._12_4_ = uVar44;
                              auVar152 = vpsrld_avx(auVar141,0x10);
                              auVar73 = ZEXT816(0) << 0x40;
                              auVar65 = vpblendw_avx(auVar141,auVar73,0xaa);
                              auVar65 = vcvtdq2ps_avx(auVar65);
                              auVar152 = vcvtdq2ps_avx(auVar152);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar23);
                              auVar170._4_4_ = uVar44;
                              auVar170._0_4_ = uVar44;
                              auVar170._8_4_ = uVar44;
                              auVar170._12_4_ = uVar44;
                              auVar174 = vsubps_avx(auVar183,auVar221);
                              auVar12 = vsubps_avx(auVar174,auVar66);
                              auVar174 = vpblendw_avx(auVar170,auVar73,0xaa);
                              auVar174 = vcvtdq2ps_avx(auVar174);
                              auVar171 = vpsrld_avx(auVar170,0x10);
                              auVar171 = vcvtdq2ps_avx(auVar171);
                              uVar44 = *(undefined4 *)(pGVar36->data + lVar47 + lVar24);
                              auVar172._4_4_ = uVar44;
                              auVar172._0_4_ = uVar44;
                              auVar172._8_4_ = uVar44;
                              auVar172._12_4_ = uVar44;
                              auVar73 = vpblendw_avx(auVar172,auVar73,0xaa);
                              auVar73 = vcvtdq2ps_avx(auVar73);
                              auVar153 = vpsrld_avx(auVar172,0x10);
                              auVar153 = vcvtdq2ps_avx(auVar153);
                              local_19d8 = local_17e8._0_8_;
                              uStack_19d0 = local_17e8._8_8_;
                              local_19c8 = local_17f8._0_8_;
                              uStack_19c0 = local_17f8._8_8_;
                              local_19b8 = local_1808._0_8_;
                              uStack_19b0 = local_1808._8_8_;
                              local_19a8 = auVar221._0_4_ * auVar73._0_4_ * 0.00012207031 +
                                           auVar12._0_4_ * auVar65._0_4_ * 0.00012207031 +
                                           auVar66._0_4_ * auVar174._0_4_ * 0.00012207031;
                              fStack_19a4 = auVar221._4_4_ * auVar73._4_4_ * 0.00012207031 +
                                            auVar12._4_4_ * auVar65._4_4_ * 0.00012207031 +
                                            auVar66._4_4_ * auVar174._4_4_ * 0.00012207031;
                              fStack_19a0 = auVar221._8_4_ * auVar73._8_4_ * 0.00012207031 +
                                            auVar12._8_4_ * auVar65._8_4_ * 0.00012207031 +
                                            auVar66._8_4_ * auVar174._8_4_ * 0.00012207031;
                              fStack_199c = auVar221._12_4_ * auVar73._12_4_ * 0.00012207031 +
                                            auVar12._12_4_ * auVar65._12_4_ * 0.00012207031 +
                                            auVar66._12_4_ * auVar174._12_4_ * 0.00012207031;
                              local_1978 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->
                                                               _geomID),0);
                              local_1998 = auVar221._0_4_ * auVar153._0_4_ * 0.00012207031 +
                                           auVar12._0_4_ * auVar152._0_4_ * 0.00012207031 +
                                           auVar66._0_4_ * auVar171._0_4_ * 0.00012207031;
                              fStack_1994 = auVar221._4_4_ * auVar153._4_4_ * 0.00012207031 +
                                            auVar12._4_4_ * auVar152._4_4_ * 0.00012207031 +
                                            auVar66._4_4_ * auVar171._4_4_ * 0.00012207031;
                              fStack_1990 = auVar221._8_4_ * auVar153._8_4_ * 0.00012207031 +
                                            auVar12._8_4_ * auVar152._8_4_ * 0.00012207031 +
                                            auVar66._8_4_ * auVar171._8_4_ * 0.00012207031;
                              fStack_198c = auVar221._12_4_ * auVar153._12_4_ * 0.00012207031 +
                                            auVar12._12_4_ * auVar152._12_4_ * 0.00012207031 +
                                            auVar66._12_4_ * auVar171._12_4_ * 0.00012207031;
                              local_1988 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)->
                                                               _primID),0);
                              vcmpps_avx(ZEXT1632((undefined1  [16])0x0),
                                         ZEXT1632((undefined1  [16])0x0),0xf);
                              uStack_1964 = context->user->instID[0];
                              local_1968 = uStack_1964;
                              uStack_1960 = uStack_1964;
                              uStack_195c = uStack_1964;
                              uStack_1958 = context->user->instPrimID[0];
                              uStack_1954 = uStack_1958;
                              uStack_1950 = uStack_1958;
                              uStack_194c = uStack_1958;
                              auVar65 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar152 = vblendvps_avx(auVar65,local_17d8,auVar74);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar152;
                              args.valid = (int *)local_1bf8;
                              args.geometryUserPtr = pGVar6->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_19d8;
                              args.N = 4;
                              local_1bf8 = auVar74;
                              args.ray = (RTCRayN *)ray;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&args);
                              }
                              if (local_1bf8 == (undefined1  [16])0x0) {
                                auVar74 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar74 = auVar74 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&args);
                                }
                                auVar152 = vpcmpeqd_avx(local_1bf8,_DAT_01f7aa10);
                                auVar74 = auVar152 ^ _DAT_01f7ae20;
                                auVar121._8_4_ = 0xff800000;
                                auVar121._0_8_ = 0xff800000ff800000;
                                auVar121._12_4_ = 0xff800000;
                                auVar152 = vblendvps_avx(auVar121,*(undefined1 (*) [16])
                                                                   (args.ray + 0x80),auVar152);
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar152;
                              }
                              auVar152 = vpslld_avx(auVar74,0x1f);
                              auVar74 = vpsrad_avx(auVar152,0x1f);
                              auVar65 = vblendvps_avx(auVar65,*(undefined1 (*) [16])local_1be0,
                                                      auVar152);
                              *(undefined1 (*) [16])local_1be0 = auVar65;
                            }
                            auVar83 = vpandn_avx(auVar74,auVar83);
                          }
                          auVar125 = ZEXT1664(auVar83);
                          lVar47 = lVar47 + 4;
                        } while ((((auVar83 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0 ||
                                  (auVar83 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar83 >> 0x5f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) || auVar83[0xf] < '\0');
                        lVar53 = 1;
                        uVar42 = 0;
                      } while (((byte)local_1bcc & local_1bd0 != 2) != 0);
                      local_1828 = auVar80._0_4_;
                      uStack_1824 = auVar80._4_4_;
                      uStack_1820 = auVar80._8_4_;
                      uStack_181c = auVar80._12_4_;
                      auVar122._0_4_ = auVar142._0_4_ ^ local_1828;
                      auVar122._4_4_ = auVar142._4_4_ ^ uStack_1824;
                      auVar122._8_4_ = auVar142._8_4_ ^ uStack_1820;
                      auVar122._12_4_ = auVar142._12_4_ ^ uStack_181c;
                      auVar142 = vorps_avx(auVar125._0_16_,auVar143);
                      auVar107 = vandps_avx(auVar142,auVar107);
                      uVar38 = vmovmskps_avx(auVar122);
                      auVar142 = auVar122;
                    } while (uVar38 != 0);
                    aVar75._0_8_ = auVar107._0_8_ ^ 0xffffffffffffffff;
                    aVar75._8_4_ = auVar107._8_4_ ^ 0xffffffff;
                    aVar75._12_4_ = auVar107._12_4_ ^ 0xffffffff;
                    uVar48 = local_1be8;
                  }
                  sVar43 = 0;
                }
                else {
                  pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  sVar43 = ((pre.super_Precalculations.grid)->troot).ptr;
                  aVar75._8_8_ = uVar35;
                  aVar75._0_8_ = uVar34;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])aVar75,(undefined1  [16])terminated.field_0);
                auVar124 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar124 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar124[0xf]) goto LAB_0152492c;
                auVar123._8_4_ = 0xff800000;
                auVar123._0_8_ = 0xff800000ff800000;
                auVar123._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar123,
                                   (undefined1  [16])terminated.field_0);
                if (sVar43 != 0) {
                  pNVar51->ptr = sVar43;
                  pNVar51 = pNVar51 + 1;
                  paVar52->i[0] = -0x800000;
                  paVar52->i[1] = -0x800000;
                  paVar52->i[2] = -0x800000;
                  paVar52->i[3] = -0x800000;
                  paVar52 = paVar52 + 1;
                }
              }
              goto LAB_01522f32;
            }
            uVar40 = root.ptr & 0xfffffffffffffff0;
            lVar45 = -0x10;
            auVar124 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar125._0_16_,6);
            aVar81.i[2] = 0x7f800000;
            aVar81._0_8_ = 0x7f8000007f800000;
            aVar81.i[3] = 0x7f800000;
            sVar43 = 8;
            do {
              root.ptr = *(size_t *)(uVar40 + 0x20 + lVar45 * 2);
              if (root.ptr == 8) {
                auVar125 = ZEXT1664((undefined1  [16])aVar81);
                root.ptr = sVar43;
                break;
              }
              fVar10 = *(float *)(uVar40 + 0x90 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x30 + lVar45);
              auVar105 = *(undefined1 (*) [16])(ray + 0x70);
              fVar103 = auVar105._0_4_;
              fVar126 = auVar105._4_4_;
              fVar55 = auVar105._8_4_;
              fVar76 = auVar105._12_4_;
              auVar130._0_4_ = fVar103 * fVar10 + fVar11;
              auVar130._4_4_ = fVar126 * fVar10 + fVar11;
              auVar130._8_4_ = fVar55 * fVar10 + fVar11;
              auVar130._12_4_ = fVar76 * fVar10 + fVar11;
              fVar10 = *(float *)(uVar40 + 0xb0 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x50 + lVar45);
              auVar144._0_4_ = fVar103 * fVar10 + fVar11;
              auVar144._4_4_ = fVar126 * fVar10 + fVar11;
              auVar144._8_4_ = fVar55 * fVar10 + fVar11;
              auVar144._12_4_ = fVar76 * fVar10 + fVar11;
              fVar10 = *(float *)(uVar40 + 0xd0 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x70 + lVar45);
              auVar154._0_4_ = fVar103 * fVar10 + fVar11;
              auVar154._4_4_ = fVar126 * fVar10 + fVar11;
              auVar154._8_4_ = fVar55 * fVar10 + fVar11;
              auVar154._12_4_ = fVar76 * fVar10 + fVar11;
              fVar10 = *(float *)(uVar40 + 0xa0 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x40 + lVar45);
              auVar175._0_4_ = fVar103 * fVar10 + fVar11;
              auVar175._4_4_ = fVar126 * fVar10 + fVar11;
              auVar175._8_4_ = fVar55 * fVar10 + fVar11;
              auVar175._12_4_ = fVar76 * fVar10 + fVar11;
              fVar10 = *(float *)(uVar40 + 0xc0 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x60 + lVar45);
              auVar191._0_4_ = fVar11 + fVar103 * fVar10;
              auVar191._4_4_ = fVar11 + fVar126 * fVar10;
              auVar191._8_4_ = fVar11 + fVar55 * fVar10;
              auVar191._12_4_ = fVar11 + fVar76 * fVar10;
              fVar10 = *(float *)(uVar40 + 0xe0 + lVar45);
              fVar11 = *(float *)(uVar40 + 0x80 + lVar45);
              auVar205._0_4_ = fVar10 * fVar103 + fVar11;
              auVar205._4_4_ = fVar10 * fVar126 + fVar11;
              auVar205._8_4_ = fVar10 * fVar55 + fVar11;
              auVar205._12_4_ = fVar10 * fVar76 + fVar11;
              auVar66._8_8_ = tray.org.field_0._8_8_;
              auVar66._0_8_ = tray.org.field_0._0_8_;
              auVar12._8_8_ = tray.org.field_0._24_8_;
              auVar12._0_8_ = tray.org.field_0._16_8_;
              auVar13._8_8_ = tray.org.field_0._40_8_;
              auVar13._0_8_ = tray.org.field_0._32_8_;
              auVar142 = vsubps_avx(auVar130,auVar66);
              auVar252._0_4_ = tray.rdir.field_0._0_4_ * auVar142._0_4_;
              auVar252._4_4_ = tray.rdir.field_0._4_4_ * auVar142._4_4_;
              auVar252._8_4_ = tray.rdir.field_0._8_4_ * auVar142._8_4_;
              auVar252._12_4_ = tray.rdir.field_0._12_4_ * auVar142._12_4_;
              auVar142 = vsubps_avx(auVar144,auVar12);
              auVar260._0_4_ = auVar142._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar260._4_4_ = auVar142._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar260._8_4_ = auVar142._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar260._12_4_ = auVar142._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar142 = vsubps_avx(auVar154,auVar13);
              auVar267._0_4_ = auVar142._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar267._4_4_ = auVar142._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar267._8_4_ = auVar142._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar267._12_4_ = auVar142._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar142 = vsubps_avx(auVar175,auVar66);
              auVar176._0_4_ = tray.rdir.field_0._0_4_ * auVar142._0_4_;
              auVar176._4_4_ = tray.rdir.field_0._4_4_ * auVar142._4_4_;
              auVar176._8_4_ = tray.rdir.field_0._8_4_ * auVar142._8_4_;
              auVar176._12_4_ = tray.rdir.field_0._12_4_ * auVar142._12_4_;
              auVar142 = vsubps_avx(auVar191,auVar12);
              auVar145._0_4_ = auVar142._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar145._4_4_ = auVar142._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar145._8_4_ = auVar142._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar145._12_4_ = auVar142._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar142 = vsubps_avx(auVar205,auVar13);
              auVar155._0_4_ = auVar142._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar155._4_4_ = auVar142._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar155._8_4_ = auVar142._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar155._12_4_ = auVar142._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar142 = vpminsd_avx(auVar252,auVar176);
              auVar80 = vpminsd_avx(auVar260,auVar145);
              auVar142 = vpmaxsd_avx(auVar142,auVar80);
              auVar80 = vpminsd_avx(auVar267,auVar155);
              auVar142 = vpmaxsd_avx(auVar142,auVar80);
              auVar80 = vpmaxsd_avx(auVar252,auVar176);
              auVar143 = vpmaxsd_avx(auVar260,auVar145);
              auVar74 = vpminsd_avx(auVar80,auVar143);
              auVar80 = vpmaxsd_avx(auVar267,auVar155);
              auVar143 = vpmaxsd_avx(auVar142,(undefined1  [16])tray.tnear.field_0);
              auVar80 = vpminsd_avx(auVar74,auVar80);
              auVar80 = vpminsd_avx(auVar80,(undefined1  [16])tray.tfar.field_0);
              if ((uVar38 & 7) == 6) {
                auVar80 = vcmpps_avx(auVar143,auVar80,2);
                uVar44 = *(undefined4 *)(uVar40 + 0xf0 + lVar45);
                auVar156._4_4_ = uVar44;
                auVar156._0_4_ = uVar44;
                auVar156._8_4_ = uVar44;
                auVar156._12_4_ = uVar44;
                auVar143 = vcmpps_avx(auVar156,auVar105,2);
                uVar44 = *(undefined4 *)(uVar40 + 0x100 + lVar45);
                auVar177._4_4_ = uVar44;
                auVar177._0_4_ = uVar44;
                auVar177._8_4_ = uVar44;
                auVar177._12_4_ = uVar44;
                auVar105 = vcmpps_avx(auVar105,auVar177,1);
                auVar105 = vandps_avx(auVar143,auVar105);
                auVar105 = vandps_avx(auVar105,auVar80);
              }
              else {
                auVar105 = vcmpps_avx(auVar143,auVar80,2);
              }
              auVar105 = vandps_avx(auVar105,auVar124);
              auVar105 = vpslld_avx(auVar105,0x1f);
              if ((((auVar105 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar105[0xf]) {
                auVar125 = ZEXT1664((undefined1  [16])aVar81);
                root.ptr = sVar43;
              }
              else {
                auVar146._8_4_ = 0x7f800000;
                auVar146._0_8_ = 0x7f8000007f800000;
                auVar146._12_4_ = 0x7f800000;
                auVar105 = vblendvps_avx(auVar146,auVar142,auVar105);
                auVar125 = ZEXT1664(auVar105);
                if (sVar43 != 8) {
                  pNVar51->ptr = sVar43;
                  pNVar51 = pNVar51 + 1;
                  *paVar52 = aVar81;
                  paVar52 = paVar52 + 1;
                }
              }
              aVar81 = auVar125._0_16_;
              lVar45 = lVar45 + 4;
              sVar43 = root.ptr;
            } while (lVar45 != 0);
            iVar39 = 4;
            if (root.ptr == 8) goto LAB_015231df;
            auVar124 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                  (undefined1  [16])auVar125._0_16_,6);
            uVar44 = vmovmskps_avx(auVar124);
          } while (bVar14 < (byte)POPCOUNT(uVar44));
          pNVar51->ptr = root.ptr;
          pNVar51 = pNVar51 + 1;
          *paVar52 = auVar125._0_16_;
          paVar52 = paVar52 + 1;
        }
        else {
          do {
            sVar43 = 0;
            if (uVar54 != 0) {
              for (; (uVar54 >> sVar43 & 1) == 0; sVar43 = sVar43 + 1) {
              }
            }
            bVar37 = occluded1(This,bvh,root,sVar43,&pre,ray,&tray,context);
            if (bVar37) {
              terminated.field_0.i[sVar43] = -1;
            }
            uVar54 = uVar54 & uVar54 - 1;
          } while (uVar54 != 0);
          auVar124 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar124 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar124 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar124 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar124[0xf]) {
            iVar39 = 3;
          }
          else {
            auVar124._8_4_ = 0xff800000;
            auVar124._0_8_ = 0xff800000ff800000;
            auVar124._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar124,
                               (undefined1  [16])terminated.field_0);
            iVar39 = 2;
          }
          uVar48 = local_1be8;
          if (local_1be8 < uVar40) goto LAB_01522f73;
        }
LAB_015231df:
      } while ((iVar39 == 4) || (iVar39 == 2));
LAB_0152492c:
      auVar8 = vandps_avx(auVar8,(undefined1  [16])terminated.field_0);
      auVar99._8_4_ = 0xff800000;
      auVar99._0_8_ = 0xff800000ff800000;
      auVar99._12_4_ = 0xff800000;
      auVar8 = vmaskmovps_avx(auVar8,auVar99);
      *(undefined1 (*) [16])local_1be0 = auVar8;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }